

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,int param_2,bool param_3)

{
  double dVar1;
  byte bVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long *plVar4;
  long *plVar5;
  long lVar6;
  long *plVar7;
  long *plVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  bool bVar18;
  int iVar19;
  fpclass_type fVar20;
  int iVar21;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  long lVar23;
  long lVar24;
  long lVar25;
  cpp_dec_float<200U,_int,_void> *pcVar26;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar27;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar28;
  uint *puVar29;
  cpp_dec_float<200U,_int,_void> *pcVar30;
  cpp_dec_float<200U,_int,_void> *pcVar31;
  uint *puVar32;
  uint uVar33;
  long lVar34;
  long in_FS_OFFSET;
  byte bVar35;
  ulong uVar36;
  Real a;
  uint local_fd4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  uint local_f44;
  SPxId enterId;
  cpp_dec_float<200U,_int,_void> local_f08;
  long *local_e88;
  long *local_e80;
  cpp_dec_float<200U,_int,_void> local_e78;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_d58;
  cpp_dec_float<200U,_int,_void> local_cd8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_c50;
  cpp_dec_float<200U,_int,_void> local_c48;
  cpp_dec_float<200U,_int,_void> local_bc8;
  cpp_dec_float<200U,_int,_void> local_b48;
  double local_ac8;
  undefined8 uStack_ac0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  degeneps;
  cpp_dec_float<200U,_int,_void> local_a38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [13];
  undefined3 uStack_8cb;
  int iStack_8c8;
  bool bStack_8c4;
  undefined8 local_8c0;
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 local_858 [13];
  undefined3 uStack_84b;
  int iStack_848;
  bool bStack_844;
  undefined8 local_840;
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  undefined1 local_7d8 [13];
  undefined3 uStack_7cb;
  int iStack_7c8;
  bool bStack_7c4;
  undefined8 local_7c0;
  undefined1 local_7b8 [16];
  undefined1 local_7a8 [16];
  undefined1 local_798 [16];
  undefined1 local_788 [16];
  undefined1 local_778 [16];
  undefined1 local_768 [16];
  undefined1 local_758 [13];
  undefined3 uStack_74b;
  int iStack_748;
  bool bStack_744;
  undefined8 local_740;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minStability;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rmaxabs;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  cmaxabs;
  cpp_dec_float<200u,int,void> local_538 [16];
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [13];
  undefined3 uStack_4cb;
  undefined5 uStack_4c8;
  undefined8 local_4c0;
  cpp_dec_float<200u,int,void> local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [13];
  undefined3 uStack_44b;
  undefined5 uStack_448;
  undefined8 local_440;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar35 = 0;
  enterId.super_DataKey.info = 0;
  enterId.super_DataKey.idx = -1;
  local_cd8.fpclass = cpp_dec_float_finite;
  local_cd8.prec_elem = 0x1c;
  local_cd8.data._M_elems[0] = 0;
  local_cd8.data._M_elems[1] = 0;
  local_cd8.data._M_elems[2] = 0;
  local_cd8.data._M_elems[3] = 0;
  local_cd8.data._M_elems[4] = 0;
  local_cd8.data._M_elems[5] = 0;
  local_cd8.data._M_elems[6] = 0;
  local_cd8.data._M_elems[7] = 0;
  local_cd8.data._M_elems[8] = 0;
  local_cd8.data._M_elems[9] = 0;
  local_cd8.data._M_elems[10] = 0;
  local_cd8.data._M_elems[0xb] = 0;
  local_cd8.data._M_elems[0xc] = 0;
  local_cd8.data._M_elems[0xd] = 0;
  local_cd8.data._M_elems[0xe] = 0;
  local_cd8.data._M_elems[0xf] = 0;
  local_cd8.data._M_elems[0x10] = 0;
  local_cd8.data._M_elems[0x11] = 0;
  local_cd8.data._M_elems[0x12] = 0;
  local_cd8.data._M_elems[0x13] = 0;
  local_cd8.data._M_elems[0x14] = 0;
  local_cd8.data._M_elems[0x15] = 0;
  local_cd8.data._M_elems[0x16] = 0;
  local_cd8.data._M_elems[0x17] = 0;
  local_cd8.data._M_elems[0x18] = 0;
  local_cd8.data._M_elems[0x19] = 0;
  local_cd8.data._M_elems._104_5_ = 0;
  local_cd8.data._M_elems[0x1b]._1_3_ = 0;
  local_cd8.exp = 0;
  local_cd8.neg = false;
  local_f08.fpclass = cpp_dec_float_finite;
  local_f08.prec_elem = 0x1c;
  local_f08.data._M_elems[0] = 0;
  local_f08.data._M_elems[1] = 0;
  local_f08.data._M_elems[2] = 0;
  local_f08.data._M_elems[3] = 0;
  local_f08.data._M_elems[4] = 0;
  local_f08.data._M_elems[5] = 0;
  local_f08.data._M_elems[6] = 0;
  local_f08.data._M_elems[7] = 0;
  local_f08.data._M_elems[8] = 0;
  local_f08.data._M_elems[9] = 0;
  local_f08.data._M_elems[10] = 0;
  local_f08.data._M_elems[0xb] = 0;
  local_f08.data._M_elems[0xc] = 0;
  local_f08.data._M_elems[0xd] = 0;
  local_f08.data._M_elems[0xe] = 0;
  local_f08.data._M_elems[0xf] = 0;
  local_f08.data._M_elems[0x10] = 0;
  local_f08.data._M_elems[0x11] = 0;
  local_f08.data._M_elems[0x12] = 0;
  local_f08.data._M_elems[0x13] = 0;
  local_f08.data._M_elems[0x14] = 0;
  local_f08.data._M_elems[0x15] = 0;
  local_f08.data._M_elems[0x16] = 0;
  local_f08.data._M_elems[0x17] = 0;
  local_f08.data._M_elems[0x18] = 0;
  local_f08.data._M_elems[0x19] = 0;
  local_f08.data._M_elems._104_5_ = 0;
  local_f08.data._M_elems[0x1b]._1_3_ = 0;
  local_f08.exp = 0;
  local_f08.neg = false;
  local_e78.fpclass = cpp_dec_float_finite;
  local_e78.prec_elem = 0x1c;
  local_e78.data._M_elems[0] = 0;
  local_e78.data._M_elems[1] = 0;
  local_e78.data._M_elems[2] = 0;
  local_e78.data._M_elems[3] = 0;
  local_e78.data._M_elems[4] = 0;
  local_e78.data._M_elems[5] = 0;
  local_e78.data._M_elems[6] = 0;
  local_e78.data._M_elems[7] = 0;
  local_e78.data._M_elems[8] = 0;
  local_e78.data._M_elems[9] = 0;
  local_e78.data._M_elems[10] = 0;
  local_e78.data._M_elems[0xb] = 0;
  local_e78.data._M_elems[0xc] = 0;
  local_e78.data._M_elems[0xd] = 0;
  local_e78.data._M_elems[0xe] = 0;
  local_e78.data._M_elems[0xf] = 0;
  local_e78.data._M_elems[0x10] = 0;
  local_e78.data._M_elems[0x11] = 0;
  local_e78.data._M_elems[0x12] = 0;
  local_e78.data._M_elems[0x13] = 0;
  local_e78.data._M_elems[0x14] = 0;
  local_e78.data._M_elems[0x15] = 0;
  local_e78.data._M_elems[0x16] = 0;
  local_e78.data._M_elems[0x17] = 0;
  local_e78.data._M_elems[0x18] = 0;
  local_e78.data._M_elems[0x19] = 0;
  local_e78.data._M_elems._104_5_ = 0;
  local_e78.data._M_elems[0x1b]._1_3_ = 0;
  local_e78.exp = 0;
  local_e78.neg = false;
  local_b48.fpclass = cpp_dec_float_finite;
  local_b48.prec_elem = 0x1c;
  local_b48.data._M_elems[0] = 0;
  local_b48.data._M_elems[1] = 0;
  local_b48.data._M_elems[2] = 0;
  local_b48.data._M_elems[3] = 0;
  local_b48.data._M_elems[4] = 0;
  local_b48.data._M_elems[5] = 0;
  local_b48.data._M_elems[6] = 0;
  local_b48.data._M_elems[7] = 0;
  local_b48.data._M_elems[8] = 0;
  local_b48.data._M_elems[9] = 0;
  local_b48.data._M_elems[10] = 0;
  local_b48.data._M_elems[0xb] = 0;
  local_b48.data._M_elems[0xc] = 0;
  local_b48.data._M_elems[0xd] = 0;
  local_b48.data._M_elems[0xe] = 0;
  local_b48.data._M_elems[0xf] = 0;
  local_b48.data._M_elems[0x10] = 0;
  local_b48.data._M_elems[0x11] = 0;
  local_b48.data._M_elems[0x12] = 0;
  local_b48.data._M_elems[0x13] = 0;
  local_b48.data._M_elems[0x14] = 0;
  local_b48.data._M_elems[0x15] = 0;
  local_b48.data._M_elems[0x16] = 0;
  local_b48.data._M_elems[0x17] = 0;
  local_b48.data._M_elems[0x18] = 0;
  local_b48.data._M_elems[0x19] = 0;
  local_b48.data._M_elems._104_5_ = 0;
  local_b48.data._M_elems[0x1b]._1_3_ = 0;
  local_b48.exp = 0;
  local_b48.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_b48,0.0);
  local_d58.fpclass = cpp_dec_float_finite;
  local_d58.prec_elem = 0x1c;
  local_d58.data._M_elems[0] = 0;
  local_d58.data._M_elems[1] = 0;
  local_d58.data._M_elems[2] = 0;
  local_d58.data._M_elems[3] = 0;
  local_d58.data._M_elems[4] = 0;
  local_d58.data._M_elems[5] = 0;
  local_d58.data._M_elems[6] = 0;
  local_d58.data._M_elems[7] = 0;
  local_d58.data._M_elems[8] = 0;
  local_d58.data._M_elems[9] = 0;
  local_d58.data._M_elems[10] = 0;
  local_d58.data._M_elems[0xb] = 0;
  local_d58.data._M_elems[0xc] = 0;
  local_d58.data._M_elems[0xd] = 0;
  local_d58.data._M_elems[0xe] = 0;
  local_d58.data._M_elems[0xf] = 0;
  local_d58.data._M_elems[0x10] = 0;
  local_d58.data._M_elems[0x11] = 0;
  local_d58.data._M_elems[0x12] = 0;
  local_d58.data._M_elems[0x13] = 0;
  local_d58.data._M_elems[0x14] = 0;
  local_d58.data._M_elems[0x15] = 0;
  local_d58.data._M_elems[0x16] = 0;
  local_d58.data._M_elems[0x17] = 0;
  local_d58.data._M_elems[0x18] = 0;
  local_d58.data._M_elems[0x19] = 0;
  local_d58.data._M_elems._104_5_ = 0;
  local_d58.data._M_elems[0x1b]._1_3_ = 0;
  local_d58.exp = 0;
  local_d58.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_d58,0.0);
  local_a38.fpclass = cpp_dec_float_finite;
  local_a38.prec_elem = 0x1c;
  local_a38.data._M_elems[0] = 0;
  local_a38.data._M_elems[1] = 0;
  local_a38.data._M_elems[2] = 0;
  local_a38.data._M_elems[3] = 0;
  local_a38.data._M_elems[4] = 0;
  local_a38.data._M_elems[5] = 0;
  local_a38.data._M_elems[6] = 0;
  local_a38.data._M_elems[7] = 0;
  local_a38.data._M_elems[8] = 0;
  local_a38.data._M_elems[9] = 0;
  local_a38.data._M_elems[10] = 0;
  local_a38.data._M_elems[0xb] = 0;
  local_a38.data._M_elems[0xc] = 0;
  local_a38.data._M_elems[0xd] = 0;
  local_a38.data._M_elems[0xe] = 0;
  local_a38.data._M_elems[0xf] = 0;
  local_a38.data._M_elems[0x10] = 0;
  local_a38.data._M_elems[0x11] = 0;
  local_a38.data._M_elems[0x12] = 0;
  local_a38.data._M_elems[0x13] = 0;
  local_a38.data._M_elems[0x14] = 0;
  local_a38.data._M_elems[0x15] = 0;
  local_a38.data._M_elems[0x16] = 0;
  local_a38.data._M_elems[0x17] = 0;
  local_a38.data._M_elems[0x18] = 0;
  local_a38.data._M_elems[0x19] = 0;
  local_a38.data._M_elems._104_5_ = 0;
  local_a38.data._M_elems[0x1b]._1_3_ = 0;
  local_a38.exp = 0;
  local_a38.neg = false;
  local_bc8.fpclass = cpp_dec_float_finite;
  local_bc8.prec_elem = 0x1c;
  local_bc8.data._M_elems[0] = 0;
  local_bc8.data._M_elems[1] = 0;
  local_bc8.data._M_elems[2] = 0;
  local_bc8.data._M_elems[3] = 0;
  local_bc8.data._M_elems[4] = 0;
  local_bc8.data._M_elems[5] = 0;
  local_bc8.data._M_elems[6] = 0;
  local_bc8.data._M_elems[7] = 0;
  local_bc8.data._M_elems[8] = 0;
  local_bc8.data._M_elems[9] = 0;
  local_bc8.data._M_elems[10] = 0;
  local_bc8.data._M_elems[0xb] = 0;
  local_bc8.data._M_elems[0xc] = 0;
  local_bc8.data._M_elems[0xd] = 0;
  local_bc8.data._M_elems[0xe] = 0;
  local_bc8.data._M_elems[0xf] = 0;
  local_bc8.data._M_elems[0x10] = 0;
  local_bc8.data._M_elems[0x11] = 0;
  local_bc8.data._M_elems[0x12] = 0;
  local_bc8.data._M_elems[0x13] = 0;
  local_bc8.data._M_elems[0x14] = 0;
  local_bc8.data._M_elems[0x15] = 0;
  local_bc8.data._M_elems[0x16] = 0;
  local_bc8.data._M_elems[0x17] = 0;
  local_bc8.data._M_elems[0x18] = 0;
  local_bc8.data._M_elems[0x19] = 0;
  local_bc8.data._M_elems._104_5_ = 0;
  local_bc8.data._M_elems[0x1b]._1_3_ = 0;
  local_bc8.exp = 0;
  local_bc8.neg = false;
  local_c48.fpclass = cpp_dec_float_finite;
  local_c48.prec_elem = 0x1c;
  local_c48.data._M_elems[0] = 0;
  local_c48.data._M_elems[1] = 0;
  local_c48.data._M_elems[2] = 0;
  local_c48.data._M_elems[3] = 0;
  local_c48.data._M_elems[4] = 0;
  local_c48.data._M_elems[5] = 0;
  local_c48.data._M_elems[6] = 0;
  local_c48.data._M_elems[7] = 0;
  local_c48.data._M_elems[8] = 0;
  local_c48.data._M_elems[9] = 0;
  local_c48.data._M_elems[10] = 0;
  local_c48.data._M_elems[0xb] = 0;
  local_c48.data._M_elems[0xc] = 0;
  local_c48.data._M_elems[0xd] = 0;
  local_c48.data._M_elems[0xe] = 0;
  local_c48.data._M_elems[0xf] = 0;
  local_c48.data._M_elems[0x10] = 0;
  local_c48.data._M_elems[0x11] = 0;
  local_c48.data._M_elems[0x12] = 0;
  local_c48.data._M_elems[0x13] = 0;
  local_c48.data._M_elems[0x14] = 0;
  local_c48.data._M_elems[0x15] = 0;
  local_c48.data._M_elems[0x16] = 0;
  local_c48.data._M_elems[0x17] = 0;
  local_c48.data._M_elems[0x18] = 0;
  local_c48.data._M_elems[0x19] = 0;
  local_c48.data._M_elems._104_5_ = 0;
  local_c48.data._M_elems[0x1b]._1_3_ = 0;
  local_c48.exp = 0;
  local_c48.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&cmaxabs.m_backend,1,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&rmaxabs.m_backend,1,(type *)0x0);
  peVar3 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  dVar1 = peVar3->s_epsilon_multiplier;
  uVar36 = -(ulong)(dVar1 == 1.0);
  minStability.m_backend.fpclass = cpp_dec_float_finite;
  minStability.m_backend.prec_elem = 0x1c;
  minStability.m_backend.data._M_elems[0] = 0;
  minStability.m_backend.data._M_elems[1] = 0;
  minStability.m_backend.data._M_elems[2] = 0;
  minStability.m_backend.data._M_elems[3] = 0;
  minStability.m_backend.data._M_elems[4] = 0;
  minStability.m_backend.data._M_elems[5] = 0;
  minStability.m_backend.data._M_elems[6] = 0;
  minStability.m_backend.data._M_elems[7] = 0;
  minStability.m_backend.data._M_elems[8] = 0;
  minStability.m_backend.data._M_elems[9] = 0;
  minStability.m_backend.data._M_elems[10] = 0;
  minStability.m_backend.data._M_elems[0xb] = 0;
  minStability.m_backend.data._M_elems[0xc] = 0;
  minStability.m_backend.data._M_elems[0xd] = 0;
  minStability.m_backend.data._M_elems[0xe] = 0;
  minStability.m_backend.data._M_elems[0xf] = 0;
  minStability.m_backend.data._M_elems[0x10] = 0;
  minStability.m_backend.data._M_elems[0x11] = 0;
  minStability.m_backend.data._M_elems[0x12] = 0;
  minStability.m_backend.data._M_elems[0x13] = 0;
  minStability.m_backend.data._M_elems[0x14] = 0;
  minStability.m_backend.data._M_elems[0x15] = 0;
  minStability.m_backend.data._M_elems[0x16] = 0;
  minStability.m_backend.data._M_elems[0x17] = 0;
  minStability.m_backend.data._M_elems[0x18] = 0;
  minStability.m_backend.data._M_elems[0x19] = 0;
  minStability.m_backend.data._M_elems._104_5_ = 0;
  minStability.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  minStability.m_backend.exp = 0;
  minStability.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&minStability,
             (double)(~uVar36 & (ulong)(dVar1 * 0.0001) | uVar36 & 0x3f1a36e2eb1c432d));
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  iVar19 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  a = Tolerances::epsilon(*(Tolerances **)(CONCAT44(extraout_var,iVar19) + 0x228));
  epsilon.m_backend.fpclass = cpp_dec_float_finite;
  epsilon.m_backend.prec_elem = 0x1c;
  epsilon.m_backend.data._M_elems[0] = 0;
  epsilon.m_backend.data._M_elems[1] = 0;
  epsilon.m_backend.data._M_elems[2] = 0;
  epsilon.m_backend.data._M_elems[3] = 0;
  epsilon.m_backend.data._M_elems[4] = 0;
  epsilon.m_backend.data._M_elems[5] = 0;
  epsilon.m_backend.data._M_elems[6] = 0;
  epsilon.m_backend.data._M_elems[7] = 0;
  epsilon.m_backend.data._M_elems[8] = 0;
  epsilon.m_backend.data._M_elems[9] = 0;
  epsilon.m_backend.data._M_elems[10] = 0;
  epsilon.m_backend.data._M_elems[0xb] = 0;
  epsilon.m_backend.data._M_elems[0xc] = 0;
  epsilon.m_backend.data._M_elems[0xd] = 0;
  epsilon.m_backend.data._M_elems[0xe] = 0;
  epsilon.m_backend.data._M_elems[0xf] = 0;
  epsilon.m_backend.data._M_elems[0x10] = 0;
  epsilon.m_backend.data._M_elems[0x11] = 0;
  epsilon.m_backend.data._M_elems[0x12] = 0;
  epsilon.m_backend.data._M_elems[0x13] = 0;
  epsilon.m_backend.data._M_elems[0x14] = 0;
  epsilon.m_backend.data._M_elems[0x15] = 0;
  epsilon.m_backend.data._M_elems[0x16] = 0;
  epsilon.m_backend.data._M_elems[0x17] = 0;
  epsilon.m_backend.data._M_elems[0x18] = 0;
  epsilon.m_backend.data._M_elems[0x19] = 0;
  epsilon.m_backend.data._M_elems._104_5_ = 0;
  epsilon.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  epsilon.m_backend.exp = 0;
  epsilon.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&epsilon,a);
  degenerateEps(&degeneps,this);
  iVar19 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  plVar4 = *(long **)(CONCAT44(extraout_var_00,iVar19) + 0x1000);
  iVar19 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar25 = *(long *)(CONCAT44(extraout_var_01,iVar19) + 0x1000);
  local_c50 = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)(lVar25 + 0x98);
  iVar19 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  plVar5 = *(long **)(CONCAT44(extraout_var_02,iVar19) + 0xff8);
  iVar19 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar6 = *(long *)(CONCAT44(extraout_var_03,iVar19) + 0xff8);
  iVar19 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_e80 = *(long **)(CONCAT44(extraout_var_04,iVar19) + 0x1018);
  iVar19 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_e88 = *(long **)(CONCAT44(extraout_var_05,iVar19) + 0x1020);
  iVar19 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  plVar7 = *(long **)(CONCAT44(extraout_var_06,iVar19) + 0x1028);
  iVar19 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  plVar8 = *(long **)(CONCAT44(extraout_var_07,iVar19) + 0x1030);
  iVar19 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var_08,iVar19) + 0xff8) + 0x98));
  iVar19 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var_09,iVar19) + 0x1000) + 0x98));
  fVar20 = epsilon.m_backend.fpclass;
  if (epsilon.m_backend.fpclass != cpp_dec_float_NaN &&
      (val->m_backend).fpclass != cpp_dec_float_NaN) {
    iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&val->m_backend,&epsilon.m_backend);
    if (0 < iVar19) {
      local_ac8 = -*(double *)(in_FS_OFFSET + -8);
      uStack_ac0 = 0x8000000000000000;
      pnVar27 = &(this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).delta;
LAB_005b1991:
      do {
        do {
          pnVar28 = val;
          pcVar26 = &local_b48;
          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
            (((cpp_dec_float<200U,_int,_void> *)&pcVar26->data)->data)._M_elems[0] =
                 (pnVar28->m_backend).data._M_elems[0];
            pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar26 + ((ulong)bVar35 * -2 + 1) * 4);
          }
          local_b48.exp = (val->m_backend).exp;
          local_b48.neg = (val->m_backend).neg;
          local_b48.fpclass = (val->m_backend).fpclass;
          local_b48.prec_elem = (val->m_backend).prec_elem;
          iVar19 = (*(this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._vptr_SPxRatioTester[3])(this);
          (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar19) + 0x368))
                    (&result_1.m_backend,(long *)CONCAT44(extraout_var_10,iVar19));
          pcVar26 = &result_1.m_backend;
          pcVar30 = &local_a38;
          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
            (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
          }
          local_a38.exp = result_1.m_backend.exp;
          local_a38.neg = result_1.m_backend.neg;
          local_a38.fpclass = result_1.m_backend.fpclass;
          local_a38.prec_elem = result_1.m_backend.prec_elem;
          maxDelta(this,&rmaxabs,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_b48,*(int *)(lVar25 + 0xa0),*(int **)(lVar25 + 0xa8),
                   *(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     **)(lVar25 + 0xb8),
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)*plVar4,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)*local_e88,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)*local_e80);
          maxDelta(this,&cmaxabs,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_b48,*(int *)(lVar6 + 0xa0),*(int **)(lVar6 + 0xa8),
                   *(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     **)(lVar6 + 0xb8),
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)*plVar5,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)*plVar8,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)*plVar7);
          if (((local_b48.fpclass != cpp_dec_float_NaN) &&
              ((val->m_backend).fpclass != cpp_dec_float_NaN)) &&
             (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_b48,&val->m_backend), iVar19 == 0)) {
            return (SPxId)enterId.super_DataKey;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&local_cd8,0);
          ::soplex::infinity::__tls_init();
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&result_1.m_backend,local_ac8);
          pcVar26 = &result_1.m_backend;
          pcVar30 = &local_d58;
          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
            (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
          }
          local_d58.exp = result_1.m_backend.exp;
          local_d58.neg = result_1.m_backend.neg;
          local_d58.fpclass = result_1.m_backend.fpclass;
          local_d58.prec_elem = result_1.m_backend.prec_elem;
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x1c;
          result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
          result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
          result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
          result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
          result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
          result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
          result.m_backend.data._M_elems[0x18] = 0;
          result.m_backend.data._M_elems[0x19] = 0;
          result.m_backend.data._M_elems._104_5_ = 0;
          result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
          result_1.m_backend.data._M_elems._16_16_ = ZEXT816(0);
          result_1.m_backend.data._M_elems._32_16_ = ZEXT816(0);
          result_1.m_backend.data._M_elems._48_16_ = ZEXT816(0);
          result_1.m_backend.data._M_elems._64_16_ = ZEXT816(0);
          result_1.m_backend.data._M_elems._80_16_ = ZEXT816(0);
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&result_1.m_backend,0.001);
          pnVar28 = &rmaxabs;
          pcVar26 = &result.m_backend;
          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
            (pcVar26->data)._M_elems[0] = (pnVar28->m_backend).data._M_elems[0];
            pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
          }
          result.m_backend.exp = rmaxabs.m_backend.exp;
          result.m_backend.neg = rmaxabs.m_backend.neg;
          result.m_backend.fpclass = rmaxabs.m_backend.fpclass;
          result.m_backend.prec_elem = rmaxabs.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&result.m_backend,&result_1.m_backend);
          pcVar26 = &result.m_backend;
          pcVar30 = &result_1.m_backend;
          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
            (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
          }
          result_1.m_backend.exp = result.m_backend.exp;
          result_1.m_backend.neg = result.m_backend.neg;
          result_1.m_backend.fpclass = result.m_backend.fpclass;
          result_1.m_backend.prec_elem = result.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&result_1.m_backend,&epsilon.m_backend);
          pcVar26 = &result_1.m_backend;
          pcVar30 = &local_c48;
          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
            (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
          }
          local_c48.exp = result_1.m_backend.exp;
          local_c48.neg = result_1.m_backend.neg;
          local_c48.fpclass = result_1.m_backend.fpclass;
          local_c48.prec_elem = result_1.m_backend.prec_elem;
          if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
              (epsilon.m_backend.fpclass != cpp_dec_float_NaN)) &&
             (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_c48,&epsilon.m_backend), iVar19 < 0)) {
            pcVar26 = &epsilon.m_backend;
            pcVar30 = &local_c48;
            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
              (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
              pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
            }
            local_c48.exp = epsilon.m_backend.exp;
            local_c48.neg = epsilon.m_backend.neg;
            local_c48.fpclass = epsilon.m_backend.fpclass;
            local_c48.prec_elem = epsilon.m_backend.prec_elem;
          }
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x1c;
          result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
          result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
          result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
          result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
          result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
          result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
          result.m_backend.data._M_elems[0x18] = 0;
          result.m_backend.data._M_elems[0x19] = 0;
          result.m_backend.data._M_elems._104_5_ = 0;
          result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
          result_1.m_backend.data._M_elems._16_16_ = ZEXT816(0);
          result_1.m_backend.data._M_elems._32_16_ = ZEXT816(0);
          result_1.m_backend.data._M_elems._48_16_ = ZEXT816(0);
          result_1.m_backend.data._M_elems._64_16_ = ZEXT816(0);
          result_1.m_backend.data._M_elems._80_16_ = ZEXT816(0);
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&result_1.m_backend,0.001);
          pnVar28 = &cmaxabs;
          pcVar26 = &result.m_backend;
          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
            (pcVar26->data)._M_elems[0] = (pnVar28->m_backend).data._M_elems[0];
            pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
          }
          result.m_backend.exp = cmaxabs.m_backend.exp;
          result.m_backend.neg = cmaxabs.m_backend.neg;
          result.m_backend.fpclass = cmaxabs.m_backend.fpclass;
          result.m_backend.prec_elem = cmaxabs.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&result.m_backend,&result_1.m_backend);
          pcVar26 = &result.m_backend;
          pcVar30 = &result_1.m_backend;
          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
            (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
          }
          result_1.m_backend.exp = result.m_backend.exp;
          result_1.m_backend.neg = result.m_backend.neg;
          result_1.m_backend.fpclass = result.m_backend.fpclass;
          result_1.m_backend.prec_elem = result.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&result_1.m_backend,&epsilon.m_backend);
          pcVar26 = &result_1.m_backend;
          pcVar30 = &local_bc8;
          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
            (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
          }
          local_bc8.exp = result_1.m_backend.exp;
          local_bc8.neg = result_1.m_backend.neg;
          local_bc8.fpclass = result_1.m_backend.fpclass;
          local_bc8.prec_elem = result_1.m_backend.prec_elem;
          if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
              (epsilon.m_backend.fpclass != cpp_dec_float_NaN)) &&
             (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_bc8,&epsilon.m_backend), iVar19 < 0)) {
            pcVar26 = &epsilon.m_backend;
            pcVar30 = &local_bc8;
            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
              (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
              pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
            }
            local_bc8.exp = epsilon.m_backend.exp;
            local_bc8.neg = epsilon.m_backend.neg;
            local_bc8.fpclass = epsilon.m_backend.fpclass;
            local_bc8.prec_elem = epsilon.m_backend.prec_elem;
          }
          local_f44 = 0xffffffff;
          local_fd4 = 0xffffffff;
          if (0 < (long)*(int *)(lVar25 + 0xa0)) {
            uVar36 = (long)*(int *)(lVar25 + 0xa0) + 1;
            local_fd4 = 0xffffffff;
            do {
              lVar23 = *(long *)(lVar25 + 0xb8);
              uVar33 = *(uint *)(*(long *)(lVar25 + 0xa8) + -8 + uVar36 * 4);
              lVar34 = (long)(int)uVar33 * 0x80;
              iVar19 = *(int *)(lVar23 + 0x70 + lVar34);
              bVar2 = *(byte *)(lVar23 + 0x74 + lVar34);
              uVar9 = *(undefined8 *)(lVar23 + 0x78 + lVar34);
              memmove(&local_f08,(void *)(lVar23 + lVar34),0x70);
              local_f08.exp = iVar19;
              local_f08.neg = (bool)bVar2;
              local_f08.fpclass = (fpclass_type)uVar9;
              local_f08.prec_elem = SUB84(uVar9,4);
              fVar20 = local_c48.fpclass;
              if (local_c48.fpclass == cpp_dec_float_NaN || (fpclass_type)uVar9 == cpp_dec_float_NaN
                 ) {
LAB_005b20b8:
                pcVar26 = &local_c48;
                pcVar30 = &result_1.m_backend;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                  pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                }
                result_1.m_backend.exp = local_c48.exp;
                result_1.m_backend.neg = local_c48.neg;
                result_1.m_backend.prec_elem = local_c48.prec_elem;
                result_1.m_backend.fpclass = fVar20;
                if (result_1.m_backend.data._M_elems[0] != 0 || fVar20 != cpp_dec_float_finite) {
                  result_1.m_backend.neg = (bool)(local_c48.neg ^ 1);
                }
                if (((fVar20 == cpp_dec_float_NaN) || (local_f08.fpclass == cpp_dec_float_NaN)) ||
                   (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             compare(&local_f08,&result_1.m_backend), -1 < iVar19)) {
                  lVar23 = *(long *)(lVar25 + 0xb8);
                  lVar34 = (long)*(int *)(*(long *)(lVar25 + 0xa8) + -8 + uVar36 * 4) * 0x80;
                  *(undefined8 *)(lVar23 + 0x78 + lVar34) = 0x1c00000000;
                  *(undefined1 (*) [16])(lVar23 + lVar34) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(lVar23 + 0x10 + lVar34) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(lVar23 + 0x20 + lVar34) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(lVar23 + 0x30 + lVar34) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(lVar23 + 0x40 + lVar34) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(lVar23 + 0x50 + lVar34) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(lVar23 + 0x60 + lVar34) = (undefined1  [16])0x0;
                  *(undefined8 *)(lVar23 + 0x6d + lVar34) = 0;
                  iVar19 = *(int *)(lVar25 + 0xa0);
                  *(int *)(lVar25 + 0xa0) = iVar19 + -1;
                  *(undefined4 *)(*(long *)(lVar25 + 0xa8) + -8 + uVar36 * 4) =
                       *(undefined4 *)(*(long *)(lVar25 + 0xa8) + -4 + (long)iVar19 * 4);
                  uVar9 = result_1.m_backend._120_8_;
                }
                else {
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)(*local_e88 + lVar34);
                  lVar23 = *plVar4;
                  result_1.m_backend.fpclass = cpp_dec_float_finite;
                  result_1.m_backend.prec_elem = 0x1c;
                  result_1.m_backend.data._M_elems[0] = 0;
                  result_1.m_backend.data._M_elems[1] = 0;
                  result_1.m_backend.data._M_elems[2] = 0;
                  result_1.m_backend.data._M_elems[3] = 0;
                  result_1.m_backend.data._M_elems[4] = 0;
                  result_1.m_backend.data._M_elems[5] = 0;
                  result_1.m_backend.data._M_elems[6] = 0;
                  result_1.m_backend.data._M_elems[7] = 0;
                  result_1.m_backend.data._M_elems[8] = 0;
                  result_1.m_backend.data._M_elems[9] = 0;
                  result_1.m_backend.data._M_elems[10] = 0;
                  result_1.m_backend.data._M_elems[0xb] = 0;
                  result_1.m_backend.data._M_elems[0xc] = 0;
                  result_1.m_backend.data._M_elems[0xd] = 0;
                  result_1.m_backend.data._M_elems[0xe] = 0;
                  result_1.m_backend.data._M_elems[0xf] = 0;
                  result_1.m_backend.data._M_elems[0x10] = 0;
                  result_1.m_backend.data._M_elems[0x11] = 0;
                  result_1.m_backend.data._M_elems[0x12] = 0;
                  result_1.m_backend.data._M_elems[0x13] = 0;
                  result_1.m_backend.data._M_elems[0x14] = 0;
                  result_1.m_backend.data._M_elems[0x15] = 0;
                  result_1.m_backend.data._M_elems[0x16] = 0;
                  result_1.m_backend.data._M_elems[0x17] = 0;
                  result_1.m_backend.data._M_elems[0x18] = 0;
                  result_1.m_backend.data._M_elems[0x19] = 0;
                  result_1.m_backend.data._M_elems._104_5_ = 0;
                  result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                  result_1.m_backend.exp = 0;
                  result_1.m_backend.neg = false;
                  if (&result_1.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar34)) {
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                              (&result_1.m_backend,pcVar26);
                    if (result_1.m_backend.data._M_elems[0] != 0 ||
                        result_1.m_backend.fpclass != cpp_dec_float_finite) {
                      result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
                    }
                  }
                  else {
                    if (&result_1.m_backend != pcVar26) {
                      pcVar30 = pcVar26;
                      pcVar22 = &result_1.m_backend;
                      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                        (pcVar22->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
                        pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                        pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar22 + (ulong)bVar35 * -8 + 4);
                      }
                      result_1.m_backend.exp = pcVar26->exp;
                      result_1.m_backend.neg = pcVar26->neg;
                      result_1.m_backend.fpclass = pcVar26->fpclass;
                      result_1.m_backend.prec_elem = pcVar26->prec_elem;
                    }
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                              (&result_1.m_backend,
                               (cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar34));
                  }
                  pcVar26 = &result_1.m_backend;
                  pcVar30 = &local_e78;
                  for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                    (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                    pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                    pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                  }
                  local_e78.exp = result_1.m_backend.exp;
                  local_e78.neg = result_1.m_backend.neg;
                  local_e78.fpclass = result_1.m_backend.fpclass;
                  local_e78.prec_elem = result_1.m_backend.prec_elem;
                  if (((result_1.m_backend.fpclass == cpp_dec_float_NaN) ||
                      (degeneps.m_backend.fpclass == cpp_dec_float_NaN)) ||
                     (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                               compare(&local_e78,&degeneps.m_backend), iVar19 < 1)) {
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                              (&local_e78,&local_f08);
                    uVar9 = result_1.m_backend._120_8_;
                    if (((local_e78.fpclass != cpp_dec_float_NaN) &&
                        (local_b48.fpclass != cpp_dec_float_NaN)) &&
                       (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                 compare(&local_e78,&local_b48), uVar9 = result_1.m_backend._120_8_,
                       iVar19 < 1)) {
                      pcVar26 = &local_f08;
                      pcVar30 = &result_1.m_backend;
                      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                        (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                        pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                        pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                      }
                      result_1.m_backend.exp = local_f08.exp;
                      result_1.m_backend.neg = local_f08.neg;
                      uVar9._0_4_ = local_f08.fpclass;
                      uVar9._4_4_ = local_f08.prec_elem;
                      result_1.m_backend.fpclass = local_f08.fpclass;
                      result_1.m_backend.prec_elem = local_f08.prec_elem;
                      if (result_1.m_backend.data._M_elems[0] != 0 ||
                          local_f08.fpclass != cpp_dec_float_finite) {
                        result_1.m_backend.neg = (bool)(local_f08.neg ^ 1);
                      }
                      if (((local_f08.fpclass != cpp_dec_float_NaN) &&
                          (uVar9 = result_1.m_backend._120_8_,
                          local_cd8.fpclass != cpp_dec_float_NaN)) &&
                         (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                   compare(&result_1.m_backend,&local_cd8),
                         uVar9 = result_1.m_backend._120_8_, -1 < iVar19)) {
                        iVar19 = (*(this->
                                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   )._vptr_SPxRatioTester[3])();
                        enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)CONCAT44(extraout_var_14,iVar19),uVar33);
                        pcVar26 = &local_e78;
                        pcVar30 = &local_d58;
                        for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                          (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                          pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                                    ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                          pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                                    ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                        }
                        local_d58.exp = local_e78.exp;
                        local_d58.neg = local_e78.neg;
                        local_d58.fpclass = local_e78.fpclass;
                        local_d58.prec_elem = local_e78.prec_elem;
                        puVar29 = local_f08.data._M_elems + 1;
                        puVar32 = local_cd8.data._M_elems + 1;
                        for (lVar23 = 0x1b; lVar23 != 0; lVar23 = lVar23 + -1) {
                          *puVar32 = *puVar29;
                          puVar29 = puVar29 + (ulong)bVar35 * -2 + 1;
                          puVar32 = puVar32 + (ulong)bVar35 * -2 + 1;
                        }
                        local_cd8.data._M_elems[0] = local_f08.data._M_elems[0];
                        local_cd8.neg =
                             (bool)((local_f08.data._M_elems[0] != 0 ||
                                    local_f08.fpclass != cpp_dec_float_finite) ^ local_f08.neg);
                        local_fd4 = uVar33;
                        uVar9 = result_1.m_backend._120_8_;
                        local_d58._120_8_ = local_e78._120_8_;
                        local_cd8.exp = local_f08.exp;
                        local_cd8._120_8_ = local_f08._120_8_;
                      }
                    }
                  }
                  else {
                    iVar19 = (*(this->
                               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._vptr_SPxRatioTester[3])();
                    pcVar26 = (cpp_dec_float<200U,_int,_void> *)(lVar34 + *plVar4);
                    local_7c0._0_4_ = cpp_dec_float_finite;
                    local_7c0._4_4_ = 0x1c;
                    local_7d8 = SUB1613((undefined1  [16])0x0,0);
                    local_7e8 = (undefined1  [16])0x0;
                    local_7f8 = (undefined1  [16])0x0;
                    local_808 = (undefined1  [16])0x0;
                    local_818 = (undefined1  [16])0x0;
                    local_828 = (undefined1  [16])0x0;
                    local_838 = (undefined1  [16])0x0;
                    uStack_7cb = 0;
                    iStack_7c8 = 0;
                    bStack_7c4 = false;
                    if ((cpp_dec_float<200U,_int,_void> *)local_838 != pcVar26) {
                      pcVar30 = pcVar26;
                      pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_838;
                      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                        (pcVar22->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
                        pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                        pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar22 + (ulong)bVar35 * -8 + 4);
                      }
                      iStack_7c8 = pcVar26->exp;
                      bStack_7c4 = pcVar26->neg;
                      local_7c0._0_4_ = pcVar26->fpclass;
                      local_7c0._4_4_ = pcVar26->prec_elem;
                    }
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                              ((cpp_dec_float<200U,_int,_void> *)local_838,&degeneps.m_backend);
                    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(extraout_var_13,iVar19),uVar33,
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)local_838);
                    uVar9 = result_1.m_backend._120_8_;
                  }
                }
              }
              else {
                iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_f08,&local_c48);
                if (iVar19 < 1) {
                  fVar20 = local_c48.fpclass;
                  goto LAB_005b20b8;
                }
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)(*local_e80 + lVar34);
                lVar23 = *plVar4;
                result_1.m_backend.fpclass = cpp_dec_float_finite;
                result_1.m_backend.prec_elem = 0x1c;
                result_1.m_backend.data._M_elems[0] = 0;
                result_1.m_backend.data._M_elems[1] = 0;
                result_1.m_backend.data._M_elems[2] = 0;
                result_1.m_backend.data._M_elems[3] = 0;
                result_1.m_backend.data._M_elems[4] = 0;
                result_1.m_backend.data._M_elems[5] = 0;
                result_1.m_backend.data._M_elems[6] = 0;
                result_1.m_backend.data._M_elems[7] = 0;
                result_1.m_backend.data._M_elems[8] = 0;
                result_1.m_backend.data._M_elems[9] = 0;
                result_1.m_backend.data._M_elems[10] = 0;
                result_1.m_backend.data._M_elems[0xb] = 0;
                result_1.m_backend.data._M_elems[0xc] = 0;
                result_1.m_backend.data._M_elems[0xd] = 0;
                result_1.m_backend.data._M_elems[0xe] = 0;
                result_1.m_backend.data._M_elems[0xf] = 0;
                result_1.m_backend.data._M_elems[0x10] = 0;
                result_1.m_backend.data._M_elems[0x11] = 0;
                result_1.m_backend.data._M_elems[0x12] = 0;
                result_1.m_backend.data._M_elems[0x13] = 0;
                result_1.m_backend.data._M_elems[0x14] = 0;
                result_1.m_backend.data._M_elems[0x15] = 0;
                result_1.m_backend.data._M_elems[0x16] = 0;
                result_1.m_backend.data._M_elems[0x17] = 0;
                result_1.m_backend.data._M_elems[0x18] = 0;
                result_1.m_backend.data._M_elems[0x19] = 0;
                result_1.m_backend.data._M_elems._104_5_ = 0;
                result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                result_1.m_backend.exp = 0;
                result_1.m_backend.neg = false;
                if (&result_1.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar34)) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            (&result_1.m_backend,pcVar26);
                  if (result_1.m_backend.data._M_elems[0] != 0 ||
                      result_1.m_backend.fpclass != cpp_dec_float_finite) {
                    result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
                  }
                }
                else {
                  if (&result_1.m_backend != pcVar26) {
                    pcVar30 = pcVar26;
                    pcVar22 = &result_1.m_backend;
                    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                      (pcVar22->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
                      pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                      pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar22 + (ulong)bVar35 * -8 + 4);
                    }
                    result_1.m_backend.exp = pcVar26->exp;
                    result_1.m_backend.neg = pcVar26->neg;
                    result_1.m_backend.fpclass = pcVar26->fpclass;
                    result_1.m_backend.prec_elem = pcVar26->prec_elem;
                  }
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            (&result_1.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar34)
                            );
                }
                pcVar26 = &result_1.m_backend;
                pcVar30 = &local_e78;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                  pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                }
                local_e78.exp = result_1.m_backend.exp;
                local_e78.neg = result_1.m_backend.neg;
                local_e78.fpclass = result_1.m_backend.fpclass;
                local_e78.prec_elem = result_1.m_backend.prec_elem;
                pnVar28 = &degeneps;
                pcVar26 = &result_1.m_backend;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pcVar26->data)._M_elems[0] = (pnVar28->m_backend).data._M_elems[0];
                  pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                }
                result_1.m_backend.exp = degeneps.m_backend.exp;
                result_1.m_backend.neg = degeneps.m_backend.neg;
                uVar10._4_4_ = degeneps.m_backend.prec_elem;
                uVar10._0_4_ = degeneps.m_backend.fpclass;
                if (result_1.m_backend.data._M_elems[0] != 0 ||
                    degeneps.m_backend.fpclass != cpp_dec_float_finite) {
                  result_1.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
                }
                fVar20 = result_1.m_backend.fpclass;
                result_1.m_backend._120_8_ = uVar10;
                if ((fVar20 == cpp_dec_float_NaN || degeneps.m_backend.fpclass == cpp_dec_float_NaN)
                   || (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                compare(&local_e78,&result_1.m_backend), -1 < iVar19)) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                            (&local_e78,&local_f08);
                  uVar9 = result_1.m_backend._120_8_;
                  if (((local_e78.fpclass != cpp_dec_float_NaN) &&
                      ((local_b48.fpclass != cpp_dec_float_NaN &&
                       (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                 compare(&local_e78,&local_b48), uVar9 = result_1.m_backend._120_8_,
                       iVar19 < 1)))) &&
                     ((local_f08.fpclass != cpp_dec_float_NaN &&
                      ((local_cd8.fpclass != cpp_dec_float_NaN &&
                       (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                 compare(&local_f08,&local_cd8), uVar9 = result_1.m_backend._120_8_,
                       -1 < iVar19)))))) {
                    iVar19 = (*(this->
                               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._vptr_SPxRatioTester[3])();
                    enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(extraout_var_11,iVar19),uVar33);
                    pcVar26 = &local_e78;
                    pcVar30 = &local_d58;
                    for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                      (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                      pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                      pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                    }
                    local_d58.exp = local_e78.exp;
                    local_d58.neg = local_e78.neg;
                    local_d58.fpclass = local_e78.fpclass;
                    local_d58.prec_elem = local_e78.prec_elem;
                    pcVar26 = &local_f08;
                    pcVar30 = &local_cd8;
                    for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                      (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                      pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                      pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                    }
                    local_cd8.neg = local_f08.neg;
                    local_fd4 = uVar33;
                    uVar9 = result_1.m_backend._120_8_;
                    local_d58._120_8_ = local_e78._120_8_;
                    local_cd8.exp = local_f08.exp;
                    local_cd8._120_8_ = local_f08._120_8_;
                  }
                }
                else {
                  iVar19 = (*(this->
                             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._vptr_SPxRatioTester[3])();
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)(lVar34 + *plVar4);
                  local_740._0_4_ = cpp_dec_float_finite;
                  local_740._4_4_ = 0x1c;
                  local_758 = SUB1613((undefined1  [16])0x0,0);
                  local_768 = (undefined1  [16])0x0;
                  local_778 = (undefined1  [16])0x0;
                  local_788 = (undefined1  [16])0x0;
                  local_798 = (undefined1  [16])0x0;
                  local_7a8 = (undefined1  [16])0x0;
                  local_7b8 = (undefined1  [16])0x0;
                  uStack_74b = 0;
                  iStack_748 = 0;
                  bStack_744 = false;
                  if ((cpp_dec_float<200U,_int,_void> *)local_7b8 != pcVar26) {
                    pcVar30 = pcVar26;
                    pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_7b8;
                    for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                      (pcVar22->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
                      pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                      pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar22 + (ulong)bVar35 * -8 + 4);
                    }
                    iStack_748 = pcVar26->exp;
                    bStack_744 = pcVar26->neg;
                    local_740._0_4_ = pcVar26->fpclass;
                    local_740._4_4_ = pcVar26->prec_elem;
                  }
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_7b8,&degeneps.m_backend);
                  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(extraout_var_12,iVar19),uVar33,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)local_7b8);
                  uVar9 = result_1.m_backend._120_8_;
                }
              }
              result_1.m_backend._120_8_ = uVar9;
              uVar36 = uVar36 - 1;
            } while (1 < uVar36);
          }
          if (0 < (long)*(int *)(lVar6 + 0xa0)) {
            local_f44 = 0xffffffff;
            uVar36 = (long)*(int *)(lVar6 + 0xa0);
            do {
              lVar23 = *(long *)(lVar6 + 0xb8);
              iVar19 = *(int *)(*(long *)(lVar6 + 0xa8) + -4 + uVar36 * 4);
              lVar34 = (long)iVar19 * 0x80;
              iVar21 = *(int *)(lVar23 + 0x70 + lVar34);
              bVar2 = *(byte *)(lVar23 + 0x74 + lVar34);
              uVar9 = *(undefined8 *)(lVar23 + 0x78 + lVar34);
              memmove(&local_f08,(void *)(lVar23 + lVar34),0x70);
              local_f08.exp = iVar21;
              local_f08.neg = (bool)bVar2;
              local_f08.fpclass = (fpclass_type)uVar9;
              local_f08.prec_elem = SUB84(uVar9,4);
              fVar20 = local_bc8.fpclass;
              if (local_bc8.fpclass == cpp_dec_float_NaN || (fpclass_type)uVar9 == cpp_dec_float_NaN
                 ) {
LAB_005b29ed:
                pcVar26 = &local_bc8;
                pcVar30 = &result_1.m_backend;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                  pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                }
                result_1.m_backend.exp = local_bc8.exp;
                result_1.m_backend.neg = local_bc8.neg;
                result_1.m_backend.prec_elem = local_bc8.prec_elem;
                result_1.m_backend.fpclass = fVar20;
                if (result_1.m_backend.data._M_elems[0] != 0 || fVar20 != cpp_dec_float_finite) {
                  result_1.m_backend.neg = (bool)(local_bc8.neg ^ 1);
                }
                if (((fVar20 == cpp_dec_float_NaN) || (local_f08.fpclass == cpp_dec_float_NaN)) ||
                   (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             compare(&local_f08,&result_1.m_backend), -1 < iVar21)) {
                  lVar23 = *(long *)(lVar6 + 0xb8);
                  lVar34 = (long)*(int *)(*(long *)(lVar6 + 0xa8) + -4 + uVar36 * 4) * 0x80;
                  *(undefined8 *)(lVar23 + 0x78 + lVar34) = 0x1c00000000;
                  *(undefined1 (*) [16])(lVar23 + lVar34) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(lVar23 + 0x10 + lVar34) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(lVar23 + 0x20 + lVar34) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(lVar23 + 0x30 + lVar34) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(lVar23 + 0x40 + lVar34) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(lVar23 + 0x50 + lVar34) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(lVar23 + 0x60 + lVar34) = (undefined1  [16])0x0;
                  *(undefined8 *)(lVar23 + 0x6d + lVar34) = 0;
                  iVar19 = *(int *)(lVar6 + 0xa0);
                  *(int *)(lVar6 + 0xa0) = iVar19 + -1;
                  *(undefined4 *)(*(long *)(lVar6 + 0xa8) + -4 + uVar36 * 4) =
                       *(undefined4 *)(*(long *)(lVar6 + 0xa8) + -4 + (long)iVar19 * 4);
                  uVar17 = result_1.m_backend._120_8_;
                }
                else {
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)(*plVar8 + lVar34);
                  lVar23 = *plVar5;
                  result_1.m_backend.fpclass = cpp_dec_float_finite;
                  result_1.m_backend.prec_elem = 0x1c;
                  result_1.m_backend.data._M_elems[0] = 0;
                  result_1.m_backend.data._M_elems[1] = 0;
                  result_1.m_backend.data._M_elems[2] = 0;
                  result_1.m_backend.data._M_elems[3] = 0;
                  result_1.m_backend.data._M_elems[4] = 0;
                  result_1.m_backend.data._M_elems[5] = 0;
                  result_1.m_backend.data._M_elems[6] = 0;
                  result_1.m_backend.data._M_elems[7] = 0;
                  result_1.m_backend.data._M_elems[8] = 0;
                  result_1.m_backend.data._M_elems[9] = 0;
                  result_1.m_backend.data._M_elems[10] = 0;
                  result_1.m_backend.data._M_elems[0xb] = 0;
                  result_1.m_backend.data._M_elems[0xc] = 0;
                  result_1.m_backend.data._M_elems[0xd] = 0;
                  result_1.m_backend.data._M_elems[0xe] = 0;
                  result_1.m_backend.data._M_elems[0xf] = 0;
                  result_1.m_backend.data._M_elems[0x10] = 0;
                  result_1.m_backend.data._M_elems[0x11] = 0;
                  result_1.m_backend.data._M_elems[0x12] = 0;
                  result_1.m_backend.data._M_elems[0x13] = 0;
                  result_1.m_backend.data._M_elems[0x14] = 0;
                  result_1.m_backend.data._M_elems[0x15] = 0;
                  result_1.m_backend.data._M_elems[0x16] = 0;
                  result_1.m_backend.data._M_elems[0x17] = 0;
                  result_1.m_backend.data._M_elems[0x18] = 0;
                  result_1.m_backend.data._M_elems[0x19] = 0;
                  result_1.m_backend.data._M_elems._104_5_ = 0;
                  result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                  result_1.m_backend.exp = 0;
                  result_1.m_backend.neg = false;
                  if (&result_1.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar34)) {
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                              (&result_1.m_backend,pcVar26);
                    if (result_1.m_backend.data._M_elems[0] != 0 ||
                        result_1.m_backend.fpclass != cpp_dec_float_finite) {
                      result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
                    }
                  }
                  else {
                    if (&result_1.m_backend != pcVar26) {
                      pcVar30 = pcVar26;
                      pcVar22 = &result_1.m_backend;
                      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                        (pcVar22->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
                        pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                        pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar22 + (ulong)bVar35 * -8 + 4);
                      }
                      result_1.m_backend.exp = pcVar26->exp;
                      result_1.m_backend.neg = pcVar26->neg;
                      result_1.m_backend.fpclass = pcVar26->fpclass;
                      result_1.m_backend.prec_elem = pcVar26->prec_elem;
                    }
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                              (&result_1.m_backend,
                               (cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar34));
                  }
                  pcVar26 = &result_1.m_backend;
                  pcVar30 = &local_e78;
                  for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                    (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                    pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                    pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                  }
                  local_e78.exp = result_1.m_backend.exp;
                  local_e78.neg = result_1.m_backend.neg;
                  local_e78.fpclass = result_1.m_backend.fpclass;
                  local_e78.prec_elem = result_1.m_backend.prec_elem;
                  if (((result_1.m_backend.fpclass == cpp_dec_float_NaN) ||
                      (degeneps.m_backend.fpclass == cpp_dec_float_NaN)) ||
                     (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                               compare(&local_e78,&degeneps.m_backend), iVar21 < 1)) {
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                              (&local_e78,&local_f08);
                    uVar17 = result_1.m_backend._120_8_;
                    if (((local_e78.fpclass != cpp_dec_float_NaN) &&
                        (local_b48.fpclass != cpp_dec_float_NaN)) &&
                       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                 compare(&local_e78,&local_b48), uVar17 = result_1.m_backend._120_8_
                       , iVar21 < 1)) {
                      pcVar26 = &local_f08;
                      pcVar30 = &result_1.m_backend;
                      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                        (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                        pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                        pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                      }
                      result_1.m_backend.exp = local_f08.exp;
                      result_1.m_backend.neg = local_f08.neg;
                      uVar17._0_4_ = local_f08.fpclass;
                      uVar17._4_4_ = local_f08.prec_elem;
                      result_1.m_backend.fpclass = local_f08.fpclass;
                      result_1.m_backend.prec_elem = local_f08.prec_elem;
                      if (result_1.m_backend.data._M_elems[0] != 0 ||
                          local_f08.fpclass != cpp_dec_float_finite) {
                        result_1.m_backend.neg = (bool)(local_f08.neg ^ 1);
                      }
                      if (((local_f08.fpclass != cpp_dec_float_NaN) &&
                          (uVar17 = result_1.m_backend._120_8_,
                          local_cd8.fpclass != cpp_dec_float_NaN)) &&
                         (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                   compare(&result_1.m_backend,&local_cd8),
                         uVar17 = result_1.m_backend._120_8_, -1 < iVar21)) {
                        iVar21 = (*(this->
                                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   )._vptr_SPxRatioTester[3])();
                        enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)CONCAT44(extraout_var_18,iVar21),iVar19);
                        pcVar26 = &local_e78;
                        pcVar30 = &local_d58;
                        for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                          (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                          pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                                    ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                          pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                                    ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                        }
                        local_d58.exp = local_e78.exp;
                        local_d58.neg = local_e78.neg;
                        local_d58.fpclass = local_e78.fpclass;
                        local_d58.prec_elem = local_e78.prec_elem;
                        puVar29 = local_f08.data._M_elems + 1;
                        puVar32 = local_cd8.data._M_elems + 1;
                        for (lVar23 = 0x1b; lVar23 != 0; lVar23 = lVar23 + -1) {
                          *puVar32 = *puVar29;
                          puVar29 = puVar29 + (ulong)bVar35 * -2 + 1;
                          puVar32 = puVar32 + (ulong)bVar35 * -2 + 1;
                        }
                        local_cd8.data._M_elems[0] = local_f08.data._M_elems[0];
                        local_cd8.neg =
                             (bool)((local_f08.data._M_elems[0] != 0 ||
                                    local_f08.fpclass != cpp_dec_float_finite) ^ local_f08.neg);
                        goto LAB_005b31b3;
                      }
                    }
                  }
                  else {
                    iVar21 = (*(this->
                               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._vptr_SPxRatioTester[3])();
                    pcVar26 = (cpp_dec_float<200U,_int,_void> *)(lVar34 + *plVar5);
                    local_8c0._0_4_ = cpp_dec_float_finite;
                    local_8c0._4_4_ = 0x1c;
                    local_8d8 = SUB1613((undefined1  [16])0x0,0);
                    local_8e8 = (undefined1  [16])0x0;
                    local_8f8 = (undefined1  [16])0x0;
                    local_908 = (undefined1  [16])0x0;
                    local_918 = (undefined1  [16])0x0;
                    local_928 = (undefined1  [16])0x0;
                    local_938 = (undefined1  [16])0x0;
                    uStack_8cb = 0;
                    iStack_8c8 = 0;
                    bStack_8c4 = false;
                    if ((cpp_dec_float<200U,_int,_void> *)local_938 != pcVar26) {
                      pcVar30 = pcVar26;
                      pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_938;
                      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                        (pcVar22->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
                        pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                        pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar22 + (ulong)bVar35 * -8 + 4);
                      }
                      iStack_8c8 = pcVar26->exp;
                      bStack_8c4 = pcVar26->neg;
                      local_8c0._0_4_ = pcVar26->fpclass;
                      local_8c0._4_4_ = pcVar26->prec_elem;
                    }
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                              ((cpp_dec_float<200U,_int,_void> *)local_938,&degeneps.m_backend);
                    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::shiftLCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(extraout_var_17,iVar21),iVar19,
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)local_938);
                    uVar17 = result_1.m_backend._120_8_;
                  }
                }
              }
              else {
                iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_f08,&local_bc8);
                if (iVar21 < 1) {
                  fVar20 = local_bc8.fpclass;
                  goto LAB_005b29ed;
                }
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)(*plVar7 + lVar34);
                lVar23 = *plVar5;
                result_1.m_backend.fpclass = cpp_dec_float_finite;
                result_1.m_backend.prec_elem = 0x1c;
                result_1.m_backend.data._M_elems[0] = 0;
                result_1.m_backend.data._M_elems[1] = 0;
                result_1.m_backend.data._M_elems[2] = 0;
                result_1.m_backend.data._M_elems[3] = 0;
                result_1.m_backend.data._M_elems[4] = 0;
                result_1.m_backend.data._M_elems[5] = 0;
                result_1.m_backend.data._M_elems[6] = 0;
                result_1.m_backend.data._M_elems[7] = 0;
                result_1.m_backend.data._M_elems[8] = 0;
                result_1.m_backend.data._M_elems[9] = 0;
                result_1.m_backend.data._M_elems[10] = 0;
                result_1.m_backend.data._M_elems[0xb] = 0;
                result_1.m_backend.data._M_elems[0xc] = 0;
                result_1.m_backend.data._M_elems[0xd] = 0;
                result_1.m_backend.data._M_elems[0xe] = 0;
                result_1.m_backend.data._M_elems[0xf] = 0;
                result_1.m_backend.data._M_elems[0x10] = 0;
                result_1.m_backend.data._M_elems[0x11] = 0;
                result_1.m_backend.data._M_elems[0x12] = 0;
                result_1.m_backend.data._M_elems[0x13] = 0;
                result_1.m_backend.data._M_elems[0x14] = 0;
                result_1.m_backend.data._M_elems[0x15] = 0;
                result_1.m_backend.data._M_elems[0x16] = 0;
                result_1.m_backend.data._M_elems[0x17] = 0;
                result_1.m_backend.data._M_elems[0x18] = 0;
                result_1.m_backend.data._M_elems[0x19] = 0;
                result_1.m_backend.data._M_elems._104_5_ = 0;
                result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                result_1.m_backend.exp = 0;
                result_1.m_backend.neg = false;
                if (&result_1.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar34)) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            (&result_1.m_backend,pcVar26);
                  if (result_1.m_backend.data._M_elems[0] != 0 ||
                      result_1.m_backend.fpclass != cpp_dec_float_finite) {
                    result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
                  }
                }
                else {
                  if (&result_1.m_backend != pcVar26) {
                    pcVar30 = pcVar26;
                    pcVar22 = &result_1.m_backend;
                    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                      (pcVar22->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
                      pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                      pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar22 + (ulong)bVar35 * -8 + 4);
                    }
                    result_1.m_backend.exp = pcVar26->exp;
                    result_1.m_backend.neg = pcVar26->neg;
                    result_1.m_backend.fpclass = pcVar26->fpclass;
                    result_1.m_backend.prec_elem = pcVar26->prec_elem;
                  }
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            (&result_1.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar34)
                            );
                }
                pcVar26 = &result_1.m_backend;
                pcVar30 = &local_e78;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                  pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                }
                local_e78.exp = result_1.m_backend.exp;
                local_e78.neg = result_1.m_backend.neg;
                local_e78.fpclass = result_1.m_backend.fpclass;
                local_e78.prec_elem = result_1.m_backend.prec_elem;
                pnVar28 = &degeneps;
                pcVar26 = &result_1.m_backend;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pcVar26->data)._M_elems[0] = (pnVar28->m_backend).data._M_elems[0];
                  pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                }
                result_1.m_backend.exp = degeneps.m_backend.exp;
                result_1.m_backend.neg = degeneps.m_backend.neg;
                uVar11._4_4_ = degeneps.m_backend.prec_elem;
                uVar11._0_4_ = degeneps.m_backend.fpclass;
                if (result_1.m_backend.data._M_elems[0] != 0 ||
                    degeneps.m_backend.fpclass != cpp_dec_float_finite) {
                  result_1.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
                }
                fVar20 = result_1.m_backend.fpclass;
                result_1.m_backend._120_8_ = uVar11;
                if ((fVar20 == cpp_dec_float_NaN || degeneps.m_backend.fpclass == cpp_dec_float_NaN)
                   || (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                compare(&local_e78,&result_1.m_backend), -1 < iVar21)) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                            (&local_e78,&local_f08);
                  uVar17 = result_1.m_backend._120_8_;
                  if (((local_e78.fpclass == cpp_dec_float_NaN) ||
                      ((local_b48.fpclass == cpp_dec_float_NaN ||
                       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                 compare(&local_e78,&local_b48), uVar17 = result_1.m_backend._120_8_
                       , 0 < iVar21)))) ||
                     ((local_f08.fpclass == cpp_dec_float_NaN ||
                      ((local_cd8.fpclass == cpp_dec_float_NaN ||
                       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                 compare(&local_f08,&local_cd8), uVar17 = result_1.m_backend._120_8_
                       , iVar21 < 0)))))) goto LAB_005b2aed;
                  iVar21 = (*(this->
                             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._vptr_SPxRatioTester[3])();
                  enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(extraout_var_15,iVar21),iVar19);
                  pcVar26 = &local_e78;
                  pcVar30 = &local_d58;
                  for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                    (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                    pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                    pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                  }
                  local_d58.exp = local_e78.exp;
                  local_d58.neg = local_e78.neg;
                  local_d58.fpclass = local_e78.fpclass;
                  local_d58.prec_elem = local_e78.prec_elem;
                  pcVar26 = &local_f08;
                  pcVar30 = &local_cd8;
                  for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                    (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                    pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                    pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                  }
                  local_cd8.neg = local_f08.neg;
LAB_005b31b3:
                  local_f44 = (uint)(uVar36 - 1);
                  uVar17 = result_1.m_backend._120_8_;
                  local_d58.exp = local_e78.exp;
                  local_d58.neg = local_e78.neg;
                  local_d58._120_8_ = local_e78._120_8_;
                  local_cd8.exp = local_f08.exp;
                  local_cd8._120_8_ = local_f08._120_8_;
                }
                else {
                  iVar21 = (*(this->
                             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._vptr_SPxRatioTester[3])();
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)(lVar34 + *plVar5);
                  local_840._0_4_ = cpp_dec_float_finite;
                  local_840._4_4_ = 0x1c;
                  local_858 = SUB1613((undefined1  [16])0x0,0);
                  local_868 = (undefined1  [16])0x0;
                  local_878 = (undefined1  [16])0x0;
                  local_888 = (undefined1  [16])0x0;
                  local_898 = (undefined1  [16])0x0;
                  local_8a8 = (undefined1  [16])0x0;
                  local_8b8 = (undefined1  [16])0x0;
                  uStack_84b = 0;
                  iStack_848 = 0;
                  bStack_844 = false;
                  if ((cpp_dec_float<200U,_int,_void> *)local_8b8 != pcVar26) {
                    pcVar30 = pcVar26;
                    pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_8b8;
                    for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                      (pcVar22->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
                      pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                      pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar22 + (ulong)bVar35 * -8 + 4);
                    }
                    iStack_848 = pcVar26->exp;
                    bStack_844 = pcVar26->neg;
                    local_840._0_4_ = pcVar26->fpclass;
                    local_840._4_4_ = pcVar26->prec_elem;
                  }
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_8b8,&degeneps.m_backend);
                  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::shiftUCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(extraout_var_16,iVar21),iVar19,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)local_8b8);
                  uVar17 = result_1.m_backend._120_8_;
                }
              }
LAB_005b2aed:
              result_1.m_backend._120_8_ = uVar17;
              bVar18 = 1 < uVar36;
              uVar36 = uVar36 - 1;
            } while (bVar18);
          }
          iVar19 = (*(this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._vptr_SPxRatioTester[3])();
          (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar19) + 0x368))
                    (&result_1.m_backend,(long *)CONCAT44(extraout_var_19,iVar19));
        } while (((local_a38.fpclass == cpp_dec_float_NaN) ||
                 (result_1.m_backend.fpclass == cpp_dec_float_NaN)) ||
                (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    (&local_a38,&result_1.m_backend), iVar19 != 0));
        if (-1 < (int)local_f44) {
          iVar19 = (*(this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._vptr_SPxRatioTester[3])();
          bVar18 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(extraout_var_20,iVar19),&enterId);
          if (!bVar18) goto LAB_005b3bfc;
          lVar23 = *(long *)(lVar6 + 0xb8);
          lVar34 = (long)*(int *)(*(long *)(lVar6 + 0xa8) + (ulong)local_f44 * 4) * 0x80;
          *(undefined8 *)(lVar23 + 0x78 + lVar34) = 0x1c00000000;
          *(undefined1 (*) [16])(lVar23 + lVar34) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(lVar23 + 0x10 + lVar34) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(lVar23 + 0x20 + lVar34) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(lVar23 + 0x30 + lVar34) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(lVar23 + 0x40 + lVar34) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(lVar23 + 0x50 + lVar34) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(lVar23 + 0x60 + lVar34) = (undefined1  [16])0x0;
          *(undefined8 *)(lVar23 + 0x6d + lVar34) = 0;
          iVar19 = *(int *)(lVar6 + 0xa0);
          *(int *)(lVar6 + 0xa0) = iVar19 + -1;
          *(undefined4 *)(*(long *)(lVar6 + 0xa8) + (ulong)local_f44 * 4) =
               *(undefined4 *)(*(long *)(lVar6 + 0xa8) + -4 + (long)iVar19 * 4);
          goto LAB_005b1991;
        }
        if ((int)local_fd4 < 0) goto LAB_005b5b1a;
        iVar19 = (*(this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._vptr_SPxRatioTester[3])();
        lVar23 = *(long *)(CONCAT44(extraout_var_21,iVar19) + 0xc58);
        lVar34 = *(long *)(lVar23 + 0x20);
        lVar23 = (long)*(int *)(*(long *)(lVar23 + 0x28) + 4 + (ulong)local_fd4 * 8);
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x1c;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems[0xe] = 0;
        result_1.m_backend.data._M_elems[0xf] = 0;
        result_1.m_backend.data._M_elems[0x10] = 0;
        result_1.m_backend.data._M_elems[0x11] = 0;
        result_1.m_backend.data._M_elems[0x12] = 0;
        result_1.m_backend.data._M_elems[0x13] = 0;
        result_1.m_backend.data._M_elems[0x14] = 0;
        result_1.m_backend.data._M_elems[0x15] = 0;
        result_1.m_backend.data._M_elems[0x16] = 0;
        result_1.m_backend.data._M_elems[0x17] = 0;
        result_1.m_backend.data._M_elems[0x18] = 0;
        result_1.m_backend.data._M_elems[0x19] = 0;
        result_1.m_backend.data._M_elems._104_5_ = 0;
        result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        iVar19 = *(int *)(lVar34 + 0xc + lVar23 * 0x28);
        if (0 < iVar19) {
          pcVar26 = *(cpp_dec_float<200U,_int,_void> **)(lVar34 + lVar23 * 0x28);
          uVar33 = iVar19 + 1;
          do {
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)(int)pcVar26[1].data._M_elems[0] * 0x80 + *plVar5);
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            pcVar30 = pcVar26;
            if ((&result.m_backend != pcVar22) && (pcVar30 = pcVar22, pcVar26 != &result.m_backend))
            {
              pcVar22 = pcVar26;
              pcVar31 = &result.m_backend;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pcVar31->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
                pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar35 * -8 + 4)
                ;
                pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4)
                ;
              }
              result.m_backend.exp = pcVar26->exp;
              result.m_backend.neg = pcVar26->neg;
              result.m_backend.fpclass = pcVar26->fpclass;
              result.m_backend.prec_elem = pcVar26->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&result.m_backend,pcVar30);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&result_1.m_backend,&result.m_backend);
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)(pcVar26[1].data._M_elems + 1);
            uVar33 = uVar33 - 1;
          } while (1 < uVar33);
        }
        pcVar26 = &result_1.m_backend;
        pnVar28 = &result;
        for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
          (pnVar28->m_backend).data._M_elems[0] = (pcVar26->data)._M_elems[0];
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
          pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
        }
        lVar23 = *plVar4;
        lVar24 = (ulong)local_fd4 * 0x80;
        pnVar28 = &result;
        puVar29 = (uint *)(lVar23 + lVar24);
        for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
          *puVar29 = (pnVar28->m_backend).data._M_elems[0];
          pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
          puVar29 = puVar29 + (ulong)bVar35 * -2 + 1;
        }
        *(int *)(lVar23 + 0x70 + lVar24) = result_1.m_backend.exp;
        *(bool *)(lVar23 + 0x74 + lVar24) = result_1.m_backend.neg;
        *(undefined8 *)(lVar23 + 0x78 + lVar24) = result_1.m_backend._120_8_;
        iVar19 = (*(this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._vptr_SPxRatioTester[3])();
        bVar18 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(extraout_var_22,iVar19),&enterId);
        if (bVar18) {
          local_440 = 0x1c00000000;
          local_4b8[0] = (cpp_dec_float<200u,int,void>)0x0;
          local_4b8[1] = (cpp_dec_float<200u,int,void>)0x0;
          local_4b8[2] = (cpp_dec_float<200u,int,void>)0x0;
          local_4b8[3] = (cpp_dec_float<200u,int,void>)0x0;
          local_4b8[4] = (cpp_dec_float<200u,int,void>)0x0;
          local_4b8[5] = (cpp_dec_float<200u,int,void>)0x0;
          local_4b8[6] = (cpp_dec_float<200u,int,void>)0x0;
          local_4b8[7] = (cpp_dec_float<200u,int,void>)0x0;
          local_4b8[8] = (cpp_dec_float<200u,int,void>)0x0;
          local_4b8[9] = (cpp_dec_float<200u,int,void>)0x0;
          local_4b8[10] = (cpp_dec_float<200u,int,void>)0x0;
          local_4b8[0xb] = (cpp_dec_float<200u,int,void>)0x0;
          local_4b8[0xc] = (cpp_dec_float<200u,int,void>)0x0;
          local_4b8[0xd] = (cpp_dec_float<200u,int,void>)0x0;
          local_4b8[0xe] = (cpp_dec_float<200u,int,void>)0x0;
          local_4b8[0xf] = (cpp_dec_float<200u,int,void>)0x0;
          local_4a8 = (undefined1  [16])0x0;
          local_498 = (undefined1  [16])0x0;
          local_488 = (undefined1  [16])0x0;
          local_478 = (undefined1  [16])0x0;
          local_468 = (undefined1  [16])0x0;
          local_458 = SUB1613((undefined1  [16])0x0,0);
          uStack_44b = 0;
          uStack_448 = 0;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=(local_4b8,0.0);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::setValue(local_c50,local_fd4,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_4b8);
          goto LAB_005b1991;
        }
        lVar23 = *(long *)(lVar25 + 0xb8);
        iVar19 = *(int *)(lVar23 + 0x70 + lVar24);
        bVar2 = *(byte *)(lVar23 + 0x74 + lVar24);
        uVar9 = *(undefined8 *)(lVar23 + 0x78 + lVar24);
        memmove(&local_f08,(void *)(lVar23 + lVar24),0x70);
        local_f08.exp = iVar19;
        local_f08.neg = (bool)bVar2;
        local_f08._120_8_ = uVar9;
        if ((fpclass_type)uVar9 == cpp_dec_float_NaN) {
LAB_005b36bb:
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)(*local_e88 + lVar24);
          lVar23 = *plVar4;
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          if (&result_1.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar24)) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&result_1.m_backend,pcVar26);
            if (result_1.m_backend.data._M_elems[0] != 0 ||
                result_1.m_backend.fpclass != cpp_dec_float_finite) {
              result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
            }
          }
          else {
            if (&result_1.m_backend != pcVar26) {
              pcVar30 = pcVar26;
              pcVar22 = &result_1.m_backend;
              for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
                (pcVar22->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
                pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4)
                ;
                pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar35 * -8 + 4)
                ;
              }
              result_1.m_backend.exp = pcVar26->exp;
              result_1.m_backend.neg = pcVar26->neg;
              result_1.m_backend.fpclass = pcVar26->fpclass;
              result_1.m_backend.prec_elem = pcVar26->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&result_1.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar24));
          }
          pcVar26 = &result_1.m_backend;
          pcVar30 = &local_d58;
          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
            (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
          }
          local_d58.exp = result_1.m_backend.exp;
          local_d58.neg = result_1.m_backend.neg;
          local_d58.fpclass = result_1.m_backend.fpclass;
          local_d58.prec_elem = result_1.m_backend.prec_elem;
          pcVar26 = &local_f08;
          pcVar30 = &result_1.m_backend;
          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
            (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
          }
          result_1.m_backend.exp = local_f08.exp;
          result_1.m_backend.neg = local_f08.neg;
          result_1.m_backend.fpclass = local_f08.fpclass;
          result_1.m_backend.prec_elem = local_f08.prec_elem;
          if (result_1.m_backend.data._M_elems[0] != 0 || local_f08.fpclass != cpp_dec_float_finite)
          {
            result_1.m_backend.neg = (bool)(local_f08.neg ^ 1);
          }
          if (((local_f08.fpclass != cpp_dec_float_NaN) &&
              (minStability.m_backend.fpclass != cpp_dec_float_NaN)) &&
             (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&result_1.m_backend,&minStability.m_backend), iVar19 < 0)) {
            pcVar26 = &local_d58;
            pcVar30 = &result.m_backend;
            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
              (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
              pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
            }
            result.m_backend.exp = local_d58.exp;
            result.m_backend.neg = local_d58.neg;
            result.m_backend.fpclass = local_d58.fpclass;
            result.m_backend.prec_elem = local_d58.prec_elem;
            if (result.m_backend.data._M_elems[0] != 0 || local_d58.fpclass != cpp_dec_float_finite)
            {
              result.m_backend.neg = (bool)(local_d58.neg ^ 1);
            }
            if (((local_d58.fpclass != cpp_dec_float_NaN) &&
                ((this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).delta.m_backend.fpclass != cpp_dec_float_NaN)) &&
               (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&result.m_backend,&pnVar27->m_backend), iVar19 < 0)) {
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 0x1c;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems[6] = 0;
              result_1.m_backend.data._M_elems[7] = 0;
              result_1.m_backend.data._M_elems[8] = 0;
              result_1.m_backend.data._M_elems[9] = 0;
              result_1.m_backend.data._M_elems[10] = 0;
              result_1.m_backend.data._M_elems[0xb] = 0;
              result_1.m_backend.data._M_elems[0xc] = 0;
              result_1.m_backend.data._M_elems[0xd] = 0;
              result_1.m_backend.data._M_elems[0xe] = 0;
              result_1.m_backend.data._M_elems[0xf] = 0;
              result_1.m_backend.data._M_elems[0x10] = 0;
              result_1.m_backend.data._M_elems[0x11] = 0;
              result_1.m_backend.data._M_elems[0x12] = 0;
              result_1.m_backend.data._M_elems[0x13] = 0;
              result_1.m_backend.data._M_elems[0x14] = 0;
              result_1.m_backend.data._M_elems[0x15] = 0;
              result_1.m_backend.data._M_elems[0x16] = 0;
              result_1.m_backend.data._M_elems[0x17] = 0;
              result_1.m_backend.data._M_elems[0x18] = 0;
              result_1.m_backend.data._M_elems[0x19] = 0;
              result_1.m_backend.data._M_elems._104_5_ = 0;
              result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&result_1.m_backend,2.0);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                        (&minStability.m_backend,&result_1.m_backend);
              iVar19 = (*(this->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              lVar23 = *plVar4;
              puVar29 = (uint *)(lVar23 + lVar24);
              pnVar28 = &local_130;
              for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
                (pnVar28->m_backend).data._M_elems[0] = *puVar29;
                puVar29 = puVar29 + (ulong)bVar35 * -2 + 1;
                pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
              }
              local_130.m_backend.exp = *(int *)(lVar23 + 0x70 + lVar24);
              local_130.m_backend.neg = *(bool *)(lVar23 + 0x74 + lVar24);
              local_130.m_backend._120_8_ = *(undefined8 *)(lVar23 + 0x78 + lVar24);
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(extraout_var_23,iVar19),local_fd4,&local_130);
              goto LAB_005b1991;
            }
          }
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (&result_1.m_backend,0,(type *)0x0);
          iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_f08,&result_1.m_backend);
          if (iVar19 < 1) goto LAB_005b36bb;
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)(*local_e80 + lVar24);
          lVar23 = *plVar4;
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          if (&result_1.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar24)) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&result_1.m_backend,pcVar26);
            if (result_1.m_backend.data._M_elems[0] != 0 ||
                result_1.m_backend.fpclass != cpp_dec_float_finite) {
              result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
            }
          }
          else {
            if (&result_1.m_backend != pcVar26) {
              pcVar30 = pcVar26;
              pcVar22 = &result_1.m_backend;
              for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
                (pcVar22->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
                pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4)
                ;
                pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar35 * -8 + 4)
                ;
              }
              result_1.m_backend.exp = pcVar26->exp;
              result_1.m_backend.neg = pcVar26->neg;
              result_1.m_backend.fpclass = pcVar26->fpclass;
              result_1.m_backend.prec_elem = pcVar26->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&result_1.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar24));
          }
          pcVar26 = &result_1.m_backend;
          pcVar30 = &local_d58;
          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
            (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
          }
          local_d58.exp = result_1.m_backend.exp;
          local_d58.neg = result_1.m_backend.neg;
          local_d58.fpclass = result_1.m_backend.fpclass;
          local_d58.prec_elem = result_1.m_backend.prec_elem;
          if (((local_f08.fpclass != cpp_dec_float_NaN) &&
              (minStability.m_backend.fpclass != cpp_dec_float_NaN)) &&
             (((iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_f08,&minStability.m_backend), iVar19 < 0 &&
               ((local_d58.fpclass != cpp_dec_float_NaN &&
                ((this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).delta.m_backend.fpclass != cpp_dec_float_NaN)))) &&
              (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&local_d58,&pnVar27->m_backend), iVar19 < 0)))) {
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x1c;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems[0xe] = 0;
            result_1.m_backend.data._M_elems[0xf] = 0;
            result_1.m_backend.data._M_elems[0x10] = 0;
            result_1.m_backend.data._M_elems[0x11] = 0;
            result_1.m_backend.data._M_elems[0x12] = 0;
            result_1.m_backend.data._M_elems[0x13] = 0;
            result_1.m_backend.data._M_elems[0x14] = 0;
            result_1.m_backend.data._M_elems[0x15] = 0;
            result_1.m_backend.data._M_elems[0x16] = 0;
            result_1.m_backend.data._M_elems[0x17] = 0;
            result_1.m_backend.data._M_elems[0x18] = 0;
            result_1.m_backend.data._M_elems[0x19] = 0;
            result_1.m_backend.data._M_elems._104_5_ = 0;
            result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&result_1.m_backend,2.0);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                      (&minStability.m_backend,&result_1.m_backend);
            iVar19 = (*(this->
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._vptr_SPxRatioTester[3])();
            lVar23 = *plVar4;
            puVar29 = (uint *)(lVar23 + lVar24);
            pnVar28 = &local_b0;
            for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
              (pnVar28->m_backend).data._M_elems[0] = *puVar29;
              puVar29 = puVar29 + (ulong)bVar35 * -2 + 1;
              pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
            }
            local_b0.m_backend.exp = *(int *)(lVar23 + 0x70 + lVar24);
            local_b0.m_backend.neg = *(bool *)(lVar23 + 0x74 + lVar24);
            local_b0.m_backend._120_8_ = *(undefined8 *)(lVar23 + 0x78 + lVar24);
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(extraout_var_24,iVar19),local_fd4,&local_b0);
            goto LAB_005b1991;
          }
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                  (&local_d58,&local_f08);
        if (((local_d58.fpclass == cpp_dec_float_NaN) || (local_b48.fpclass == cpp_dec_float_NaN))
           || (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&local_d58,&local_b48), iVar19 < 1)) goto LAB_005b3bfc;
      } while( true );
    }
    fVar20 = epsilon.m_backend.fpclass;
  }
  pnVar27 = &epsilon;
  pnVar28 = &result_1;
  for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
    (pnVar28->m_backend).data._M_elems[0] = (pnVar27->m_backend).data._M_elems[0];
    pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar27 + ((ulong)bVar35 * -2 + 1) * 4);
    pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
  }
  result_1.m_backend.exp = epsilon.m_backend.exp;
  result_1.m_backend.neg = epsilon.m_backend.neg;
  result_1.m_backend.prec_elem = epsilon.m_backend.prec_elem;
  result_1.m_backend.fpclass = fVar20;
  if (result_1.m_backend.data._M_elems[0] != 0 || fVar20 != cpp_dec_float_finite) {
    result_1.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
  }
  if (((fVar20 == cpp_dec_float_NaN) || ((val->m_backend).fpclass == cpp_dec_float_NaN)) ||
     (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&val->m_backend,&result_1.m_backend), -1 < iVar19)) {
LAB_005b3bfc:
    pcVar26 = &local_d58;
    pnVar27 = val;
    for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
      (pnVar27->m_backend).data._M_elems[0] = (pcVar26->data)._M_elems[0];
      pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + ((ulong)bVar35 * -2 + 1) * 4);
      pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar27 + ((ulong)bVar35 * -2 + 1) * 4);
    }
    (val->m_backend).exp = local_d58.exp;
    (val->m_backend).neg = local_d58.neg;
    (val->m_backend).fpclass = local_d58.fpclass;
    (val->m_backend).prec_elem = local_d58.prec_elem;
    return (SPxId)enterId.super_DataKey;
  }
  local_ac8 = *(double *)(in_FS_OFFSET + -8);
  pnVar27 = &(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).delta;
LAB_005b3c6a:
  do {
    do {
      pnVar28 = val;
      pcVar26 = &local_b48;
      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&pcVar26->data)->data)._M_elems[0] =
             (pnVar28->m_backend).data._M_elems[0];
        pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
        pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + ((ulong)bVar35 * -2 + 1) * 4);
      }
      local_b48.exp = (val->m_backend).exp;
      local_b48.neg = (val->m_backend).neg;
      local_b48.fpclass = (val->m_backend).fpclass;
      local_b48.prec_elem = (val->m_backend).prec_elem;
      iVar19 = (*(this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxRatioTester[3])(this);
      (**(code **)(*(long *)CONCAT44(extraout_var_25,iVar19) + 0x368))
                (&result_1.m_backend,(long *)CONCAT44(extraout_var_25,iVar19));
      pcVar26 = &result_1.m_backend;
      pcVar30 = &local_a38;
      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
        (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
        pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
        pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
      }
      local_a38.exp = result_1.m_backend.exp;
      local_a38.neg = result_1.m_backend.neg;
      local_a38.fpclass = result_1.m_backend.fpclass;
      local_a38.prec_elem = result_1.m_backend.prec_elem;
      minDelta(this,&rmaxabs,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_b48,*(int *)(lVar25 + 0xa0),*(int **)(lVar25 + 0xa8),
               *(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 **)(lVar25 + 0xb8),
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*plVar4,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*local_e88,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*local_e80);
      minDelta(this,&cmaxabs,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_b48,*(int *)(lVar6 + 0xa0),*(int **)(lVar6 + 0xa8),
               *(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 **)(lVar6 + 0xb8),
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*plVar5,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*plVar8,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*plVar7);
      if (((local_b48.fpclass != cpp_dec_float_NaN) &&
          ((val->m_backend).fpclass != cpp_dec_float_NaN)) &&
         (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_b48,&val->m_backend), iVar19 == 0)) {
        return (SPxId)enterId.super_DataKey;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&local_cd8,0);
      ::soplex::infinity::__tls_init();
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x1c;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems[8] = 0;
      result_1.m_backend.data._M_elems[9] = 0;
      result_1.m_backend.data._M_elems[10] = 0;
      result_1.m_backend.data._M_elems[0xb] = 0;
      result_1.m_backend.data._M_elems[0xc] = 0;
      result_1.m_backend.data._M_elems[0xd] = 0;
      result_1.m_backend.data._M_elems[0xe] = 0;
      result_1.m_backend.data._M_elems[0xf] = 0;
      result_1.m_backend.data._M_elems[0x10] = 0;
      result_1.m_backend.data._M_elems[0x11] = 0;
      result_1.m_backend.data._M_elems[0x12] = 0;
      result_1.m_backend.data._M_elems[0x13] = 0;
      result_1.m_backend.data._M_elems[0x14] = 0;
      result_1.m_backend.data._M_elems[0x15] = 0;
      result_1.m_backend.data._M_elems[0x16] = 0;
      result_1.m_backend.data._M_elems[0x17] = 0;
      result_1.m_backend.data._M_elems[0x18] = 0;
      result_1.m_backend.data._M_elems[0x19] = 0;
      result_1.m_backend.data._M_elems._104_5_ = 0;
      result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&result_1.m_backend,local_ac8);
      pcVar26 = &result_1.m_backend;
      pcVar30 = &local_d58;
      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
        (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
        pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
        pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
      }
      local_d58.exp = result_1.m_backend.exp;
      local_d58.neg = result_1.m_backend.neg;
      local_d58.fpclass = result_1.m_backend.fpclass;
      local_d58.prec_elem = result_1.m_backend.prec_elem;
      pnVar28 = &rmaxabs;
      pcVar26 = &result_10.m_backend;
      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
        (pcVar26->data)._M_elems[0] = (pnVar28->m_backend).data._M_elems[0];
        pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
        pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
      }
      result_10.m_backend.exp = rmaxabs.m_backend.exp;
      result_10.m_backend.neg = rmaxabs.m_backend.neg;
      result_10.m_backend.fpclass = rmaxabs.m_backend.fpclass;
      result_10.m_backend.prec_elem = rmaxabs.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&result_10.m_backend,&epsilon.m_backend);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
      result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
      result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x1c;
      result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems._48_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems._64_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems._80_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems[0x18] = 0;
      result_1.m_backend.data._M_elems[0x19] = 0;
      result_1.m_backend.data._M_elems._104_5_ = 0;
      result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&result_1.m_backend,0.001);
      pcVar26 = &result_10.m_backend;
      pcVar30 = &result.m_backend;
      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
        (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
        pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
        pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
      }
      result.m_backend.exp = result_10.m_backend.exp;
      result.m_backend.neg = result_10.m_backend.neg;
      result.m_backend.fpclass = result_10.m_backend.fpclass;
      result.m_backend.prec_elem = result_10.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&result.m_backend,&result_1.m_backend);
      pcVar26 = &result.m_backend;
      pcVar30 = &local_c48;
      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
        (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
        pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
        pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
      }
      local_c48.exp = result.m_backend.exp;
      local_c48.neg = result.m_backend.neg;
      local_c48.fpclass = result.m_backend.fpclass;
      local_c48.prec_elem = result.m_backend.prec_elem;
      pnVar28 = &cmaxabs;
      pcVar26 = &result_10.m_backend;
      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
        (pcVar26->data)._M_elems[0] = (pnVar28->m_backend).data._M_elems[0];
        pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
        pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
      }
      result_10.m_backend.exp = cmaxabs.m_backend.exp;
      result_10.m_backend.neg = cmaxabs.m_backend.neg;
      result_10.m_backend.fpclass = cmaxabs.m_backend.fpclass;
      result_10.m_backend.prec_elem = cmaxabs.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&result_10.m_backend,&epsilon.m_backend);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
      result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
      result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x1c;
      result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems._48_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems._64_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems._80_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems[0x18] = 0;
      result_1.m_backend.data._M_elems[0x19] = 0;
      result_1.m_backend.data._M_elems._104_5_ = 0;
      result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&result_1.m_backend,0.001);
      pcVar26 = &result_10.m_backend;
      pcVar30 = &result.m_backend;
      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
        (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
        pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
        pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
      }
      result.m_backend.exp = result_10.m_backend.exp;
      result.m_backend.neg = result_10.m_backend.neg;
      result.m_backend.fpclass = result_10.m_backend.fpclass;
      result.m_backend.prec_elem = result_10.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&result.m_backend,&result_1.m_backend);
      pcVar26 = &result.m_backend;
      pcVar30 = &local_bc8;
      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
        (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
        pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
        pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
      }
      local_bc8.exp = result.m_backend.exp;
      local_bc8.neg = result.m_backend.neg;
      local_bc8.fpclass = result.m_backend.fpclass;
      local_bc8.prec_elem = result.m_backend.prec_elem;
      local_f44 = 0xffffffff;
      local_fd4 = 0xffffffff;
      if (0 < (long)*(int *)(lVar25 + 0xa0)) {
        uVar36 = (long)*(int *)(lVar25 + 0xa0) + 1;
        local_fd4 = 0xffffffff;
        do {
          lVar23 = *(long *)(lVar25 + 0xb8);
          uVar33 = *(uint *)(*(long *)(lVar25 + 0xa8) + -8 + uVar36 * 4);
          lVar34 = (long)(int)uVar33 * 0x80;
          iVar19 = *(int *)(lVar23 + 0x70 + lVar34);
          bVar2 = *(byte *)(lVar23 + 0x74 + lVar34);
          uVar9 = *(undefined8 *)(lVar23 + 0x78 + lVar34);
          memmove(&local_f08,(void *)(lVar23 + lVar34),0x70);
          local_f08.exp = iVar19;
          local_f08.neg = (bool)bVar2;
          local_f08.fpclass = (fpclass_type)uVar9;
          local_f08.prec_elem = SUB84(uVar9,4);
          fVar20 = local_c48.fpclass;
          if (local_c48.fpclass == cpp_dec_float_NaN || (fpclass_type)uVar9 == cpp_dec_float_NaN) {
LAB_005b42cd:
            pcVar26 = &local_c48;
            pcVar30 = &result_1.m_backend;
            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
              (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
              pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
            }
            result_1.m_backend.exp = local_c48.exp;
            result_1.m_backend.neg = local_c48.neg;
            result_1.m_backend.prec_elem = local_c48.prec_elem;
            result_1.m_backend.fpclass = fVar20;
            if (result_1.m_backend.data._M_elems[0] != 0 || fVar20 != cpp_dec_float_finite) {
              result_1.m_backend.neg = (bool)(local_c48.neg ^ 1);
            }
            if (((fVar20 == cpp_dec_float_NaN) || (local_f08.fpclass == cpp_dec_float_NaN)) ||
               (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_f08,&result_1.m_backend), -1 < iVar19)) {
              lVar23 = *(long *)(lVar25 + 0xb8);
              lVar34 = (long)*(int *)(*(long *)(lVar25 + 0xa8) + -8 + uVar36 * 4) * 0x80;
              *(undefined8 *)(lVar23 + 0x78 + lVar34) = 0x1c00000000;
              *(undefined1 (*) [16])(lVar23 + lVar34) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar23 + 0x10 + lVar34) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar23 + 0x20 + lVar34) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar23 + 0x30 + lVar34) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar23 + 0x40 + lVar34) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar23 + 0x50 + lVar34) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar23 + 0x60 + lVar34) = (undefined1  [16])0x0;
              *(undefined8 *)(lVar23 + 0x6d + lVar34) = 0;
              iVar19 = *(int *)(lVar25 + 0xa0);
              *(int *)(lVar25 + 0xa0) = iVar19 + -1;
              *(undefined4 *)(*(long *)(lVar25 + 0xa8) + -8 + uVar36 * 4) =
                   *(undefined4 *)(*(long *)(lVar25 + 0xa8) + -4 + (long)iVar19 * 4);
              uVar16 = result_1.m_backend._120_8_;
            }
            else {
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)(*local_e80 + lVar34);
              lVar23 = *plVar4;
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 0x1c;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems[6] = 0;
              result_1.m_backend.data._M_elems[7] = 0;
              result_1.m_backend.data._M_elems[8] = 0;
              result_1.m_backend.data._M_elems[9] = 0;
              result_1.m_backend.data._M_elems[10] = 0;
              result_1.m_backend.data._M_elems[0xb] = 0;
              result_1.m_backend.data._M_elems[0xc] = 0;
              result_1.m_backend.data._M_elems[0xd] = 0;
              result_1.m_backend.data._M_elems[0xe] = 0;
              result_1.m_backend.data._M_elems[0xf] = 0;
              result_1.m_backend.data._M_elems[0x10] = 0;
              result_1.m_backend.data._M_elems[0x11] = 0;
              result_1.m_backend.data._M_elems[0x12] = 0;
              result_1.m_backend.data._M_elems[0x13] = 0;
              result_1.m_backend.data._M_elems[0x14] = 0;
              result_1.m_backend.data._M_elems[0x15] = 0;
              result_1.m_backend.data._M_elems[0x16] = 0;
              result_1.m_backend.data._M_elems[0x17] = 0;
              result_1.m_backend.data._M_elems[0x18] = 0;
              result_1.m_backend.data._M_elems[0x19] = 0;
              result_1.m_backend.data._M_elems._104_5_ = 0;
              result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              if (&result_1.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar34)) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          (&result_1.m_backend,pcVar26);
                if (result_1.m_backend.data._M_elems[0] != 0 ||
                    result_1.m_backend.fpclass != cpp_dec_float_finite) {
                  result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
                }
              }
              else {
                if (&result_1.m_backend != pcVar26) {
                  pcVar30 = pcVar26;
                  pcVar22 = &result_1.m_backend;
                  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                    (pcVar22->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
                    pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                    pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar22 + (ulong)bVar35 * -8 + 4);
                  }
                  result_1.m_backend.exp = pcVar26->exp;
                  result_1.m_backend.neg = pcVar26->neg;
                  result_1.m_backend.fpclass = pcVar26->fpclass;
                  result_1.m_backend.prec_elem = pcVar26->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          (&result_1.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar34));
              }
              pcVar26 = &result_1.m_backend;
              pcVar30 = &local_e78;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4)
                ;
                pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4)
                ;
              }
              local_e78.exp = result_1.m_backend.exp;
              local_e78.neg = result_1.m_backend.neg;
              local_e78.fpclass = result_1.m_backend.fpclass;
              local_e78.prec_elem = result_1.m_backend.prec_elem;
              pnVar28 = &degeneps;
              pcVar26 = &result_1.m_backend;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pcVar26->data)._M_elems[0] = (pnVar28->m_backend).data._M_elems[0];
                pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4)
                ;
              }
              result_1.m_backend.exp = degeneps.m_backend.exp;
              result_1.m_backend.neg = degeneps.m_backend.neg;
              uVar12._4_4_ = degeneps.m_backend.prec_elem;
              uVar12._0_4_ = degeneps.m_backend.fpclass;
              if (result_1.m_backend.data._M_elems[0] != 0 ||
                  degeneps.m_backend.fpclass != cpp_dec_float_finite) {
                result_1.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
              }
              fVar20 = result_1.m_backend.fpclass;
              result_1.m_backend._120_8_ = uVar12;
              if ((fVar20 == cpp_dec_float_NaN || degeneps.m_backend.fpclass == cpp_dec_float_NaN)
                 || (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              compare(&local_e78,&result_1.m_backend), -1 < iVar19)) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                          (&local_e78,&local_f08);
                uVar16 = result_1.m_backend._120_8_;
                if ((local_e78.fpclass != cpp_dec_float_NaN) &&
                   ((local_b48.fpclass != cpp_dec_float_NaN &&
                    (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              compare(&local_e78,&local_b48), uVar16 = result_1.m_backend._120_8_,
                    -1 < iVar19)))) {
                  pcVar26 = &local_f08;
                  pcVar30 = &result_1.m_backend;
                  for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                    (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                    pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                    pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                  }
                  result_1.m_backend.exp = local_f08.exp;
                  result_1.m_backend.neg = local_f08.neg;
                  uVar16._0_4_ = local_f08.fpclass;
                  uVar16._4_4_ = local_f08.prec_elem;
                  result_1.m_backend.fpclass = local_f08.fpclass;
                  result_1.m_backend.prec_elem = local_f08.prec_elem;
                  if (result_1.m_backend.data._M_elems[0] != 0 ||
                      local_f08.fpclass != cpp_dec_float_finite) {
                    result_1.m_backend.neg = (bool)(local_f08.neg ^ 1);
                  }
                  if (((local_f08.fpclass != cpp_dec_float_NaN) &&
                      (uVar16 = result_1.m_backend._120_8_, local_cd8.fpclass != cpp_dec_float_NaN))
                     && (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                  compare(&result_1.m_backend,&local_cd8),
                        uVar16 = result_1.m_backend._120_8_, 0 < iVar19)) {
                    iVar19 = (*(this->
                               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._vptr_SPxRatioTester[3])();
                    enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(extraout_var_28,iVar19),uVar33);
                    pcVar26 = &local_e78;
                    pcVar30 = &local_d58;
                    for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                      (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                      pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                      pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                    }
                    local_d58.exp = local_e78.exp;
                    local_d58.neg = local_e78.neg;
                    local_d58.fpclass = local_e78.fpclass;
                    local_d58.prec_elem = local_e78.prec_elem;
                    puVar29 = local_f08.data._M_elems + 1;
                    puVar32 = local_cd8.data._M_elems + 1;
                    for (lVar23 = 0x1b; lVar23 != 0; lVar23 = lVar23 + -1) {
                      *puVar32 = *puVar29;
                      puVar29 = puVar29 + (ulong)bVar35 * -2 + 1;
                      puVar32 = puVar32 + (ulong)bVar35 * -2 + 1;
                    }
                    local_cd8.data._M_elems[0] = local_f08.data._M_elems[0];
                    local_cd8.neg =
                         (bool)((local_f08.data._M_elems[0] != 0 ||
                                local_f08.fpclass != cpp_dec_float_finite) ^ local_f08.neg);
                    local_fd4 = uVar33;
                    uVar16 = result_1.m_backend._120_8_;
                    local_d58._120_8_ = local_e78._120_8_;
                    local_cd8.exp = local_f08.exp;
                    local_cd8._120_8_ = local_f08._120_8_;
                  }
                }
              }
              else {
                iVar19 = (*(this->
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._vptr_SPxRatioTester[3])();
                lVar23 = *plVar4;
                puVar29 = (uint *)(lVar23 + lVar34);
                pnVar28 = &local_230;
                for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                  (pnVar28->m_backend).data._M_elems[0] = *puVar29;
                  puVar29 = puVar29 + (ulong)bVar35 * -2 + 1;
                  pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
                }
                local_230.m_backend.exp = *(int *)(lVar23 + 0x70 + lVar34);
                local_230.m_backend.neg = *(bool *)(lVar23 + 0x74 + lVar34);
                local_230.m_backend._120_8_ = *(undefined8 *)(lVar23 + 0x78 + lVar34);
                SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(extraout_var_29,iVar19),uVar33,&local_230);
                uVar16 = result_1.m_backend._120_8_;
              }
            }
          }
          else {
            iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_f08,&local_c48);
            if (iVar19 < 1) {
              fVar20 = local_c48.fpclass;
              goto LAB_005b42cd;
            }
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)(*local_e88 + lVar34);
            lVar23 = *plVar4;
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x1c;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems[0xe] = 0;
            result_1.m_backend.data._M_elems[0xf] = 0;
            result_1.m_backend.data._M_elems[0x10] = 0;
            result_1.m_backend.data._M_elems[0x11] = 0;
            result_1.m_backend.data._M_elems[0x12] = 0;
            result_1.m_backend.data._M_elems[0x13] = 0;
            result_1.m_backend.data._M_elems[0x14] = 0;
            result_1.m_backend.data._M_elems[0x15] = 0;
            result_1.m_backend.data._M_elems[0x16] = 0;
            result_1.m_backend.data._M_elems[0x17] = 0;
            result_1.m_backend.data._M_elems[0x18] = 0;
            result_1.m_backend.data._M_elems[0x19] = 0;
            result_1.m_backend.data._M_elems._104_5_ = 0;
            result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            if (&result_1.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar34)) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&result_1.m_backend,pcVar26);
              if (result_1.m_backend.data._M_elems[0] != 0 ||
                  result_1.m_backend.fpclass != cpp_dec_float_finite) {
                result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
              }
            }
            else {
              if (&result_1.m_backend != pcVar26) {
                pcVar30 = pcVar26;
                pcVar22 = &result_1.m_backend;
                for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                  (pcVar22->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
                  pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                  pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar22 + (ulong)bVar35 * -8 + 4);
                }
                result_1.m_backend.exp = pcVar26->exp;
                result_1.m_backend.neg = pcVar26->neg;
                result_1.m_backend.fpclass = pcVar26->fpclass;
                result_1.m_backend.prec_elem = pcVar26->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&result_1.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar34));
            }
            pcVar26 = &result_1.m_backend;
            pcVar30 = &local_e78;
            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
              (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
              pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
            }
            local_e78.exp = result_1.m_backend.exp;
            local_e78.neg = result_1.m_backend.neg;
            local_e78.fpclass = result_1.m_backend.fpclass;
            local_e78.prec_elem = result_1.m_backend.prec_elem;
            if (((result_1.m_backend.fpclass == cpp_dec_float_NaN) ||
                (degeneps.m_backend.fpclass == cpp_dec_float_NaN)) ||
               (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_e78,&degeneps.m_backend), iVar19 < 1)) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                        (&local_e78,&local_f08);
              uVar16 = result_1.m_backend._120_8_;
              if (((local_e78.fpclass != cpp_dec_float_NaN) &&
                  (local_b48.fpclass != cpp_dec_float_NaN)) &&
                 ((iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                      (&local_e78,&local_b48), uVar16 = result_1.m_backend._120_8_,
                  -1 < iVar19 &&
                  (((local_f08.fpclass != cpp_dec_float_NaN &&
                    (local_cd8.fpclass != cpp_dec_float_NaN)) &&
                   (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             compare(&local_f08,&local_cd8), uVar16 = result_1.m_backend._120_8_,
                   0 < iVar19)))))) {
                iVar19 = (*(this->
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._vptr_SPxRatioTester[3])();
                enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(extraout_var_27,iVar19),uVar33);
                pcVar26 = &local_e78;
                pcVar30 = &local_d58;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                  pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                }
                local_d58.exp = local_e78.exp;
                local_d58.neg = local_e78.neg;
                local_d58.fpclass = local_e78.fpclass;
                local_d58.prec_elem = local_e78.prec_elem;
                pcVar26 = &local_f08;
                pcVar30 = &local_cd8;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                  pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                }
                local_cd8.neg = local_f08.neg;
                local_fd4 = uVar33;
                uVar16 = result_1.m_backend._120_8_;
                local_d58._120_8_ = local_e78._120_8_;
                local_cd8.exp = local_f08.exp;
                local_cd8._120_8_ = local_f08._120_8_;
              }
            }
            else {
              iVar19 = (*(this->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              lVar23 = *plVar4;
              puVar29 = (uint *)(lVar23 + lVar34);
              pnVar28 = &local_1b0;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pnVar28->m_backend).data._M_elems[0] = *puVar29;
                puVar29 = puVar29 + (ulong)bVar35 * -2 + 1;
                pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
              }
              local_1b0.m_backend.exp = *(int *)(lVar23 + 0x70 + lVar34);
              local_1b0.m_backend.neg = *(bool *)(lVar23 + 0x74 + lVar34);
              local_1b0.m_backend._120_8_ = *(undefined8 *)(lVar23 + 0x78 + lVar34);
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(extraout_var_26,iVar19),uVar33,&local_1b0);
              uVar16 = result_1.m_backend._120_8_;
            }
          }
          result_1.m_backend._120_8_ = uVar16;
          uVar36 = uVar36 - 1;
        } while (1 < uVar36);
      }
      if (0 < (long)*(int *)(lVar6 + 0xa0)) {
        local_f44 = 0xffffffff;
        uVar36 = (long)*(int *)(lVar6 + 0xa0);
        do {
          lVar23 = *(long *)(lVar6 + 0xb8);
          iVar19 = *(int *)(*(long *)(lVar6 + 0xa8) + -4 + uVar36 * 4);
          lVar34 = (long)iVar19 * 0x80;
          iVar21 = *(int *)(lVar23 + 0x70 + lVar34);
          bVar2 = *(byte *)(lVar23 + 0x74 + lVar34);
          uVar9 = *(undefined8 *)(lVar23 + 0x78 + lVar34);
          memmove(&local_f08,(void *)(lVar23 + lVar34),0x70);
          local_f08.exp = iVar21;
          local_f08.neg = (bool)bVar2;
          local_f08.fpclass = (fpclass_type)uVar9;
          local_f08.prec_elem = SUB84(uVar9,4);
          fVar20 = local_bc8.fpclass;
          if (local_bc8.fpclass == cpp_dec_float_NaN || (fpclass_type)uVar9 == cpp_dec_float_NaN) {
LAB_005b4b0b:
            pcVar26 = &local_bc8;
            pcVar30 = &result_1.m_backend;
            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
              (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
              pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
            }
            result_1.m_backend.exp = local_bc8.exp;
            result_1.m_backend.neg = local_bc8.neg;
            result_1.m_backend.prec_elem = local_bc8.prec_elem;
            result_1.m_backend.fpclass = fVar20;
            if (result_1.m_backend.data._M_elems[0] != 0 || fVar20 != cpp_dec_float_finite) {
              result_1.m_backend.neg = (bool)(local_bc8.neg ^ 1);
            }
            if (((fVar20 == cpp_dec_float_NaN) || (local_f08.fpclass == cpp_dec_float_NaN)) ||
               (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_f08,&result_1.m_backend), -1 < iVar21)) {
              lVar23 = *(long *)(lVar6 + 0xb8);
              lVar34 = (long)*(int *)(*(long *)(lVar6 + 0xa8) + -4 + uVar36 * 4) * 0x80;
              *(undefined8 *)(lVar23 + 0x78 + lVar34) = 0x1c00000000;
              *(undefined1 (*) [16])(lVar23 + lVar34) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar23 + 0x10 + lVar34) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar23 + 0x20 + lVar34) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar23 + 0x30 + lVar34) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar23 + 0x40 + lVar34) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar23 + 0x50 + lVar34) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar23 + 0x60 + lVar34) = (undefined1  [16])0x0;
              *(undefined8 *)(lVar23 + 0x6d + lVar34) = 0;
              iVar19 = *(int *)(lVar6 + 0xa0);
              *(int *)(lVar6 + 0xa0) = iVar19 + -1;
              *(undefined4 *)(*(long *)(lVar6 + 0xa8) + -4 + uVar36 * 4) =
                   *(undefined4 *)(*(long *)(lVar6 + 0xa8) + -4 + (long)iVar19 * 4);
              uVar15 = result_1.m_backend._120_8_;
            }
            else {
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)(*plVar7 + lVar34);
              lVar23 = *plVar5;
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 0x1c;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems[6] = 0;
              result_1.m_backend.data._M_elems[7] = 0;
              result_1.m_backend.data._M_elems[8] = 0;
              result_1.m_backend.data._M_elems[9] = 0;
              result_1.m_backend.data._M_elems[10] = 0;
              result_1.m_backend.data._M_elems[0xb] = 0;
              result_1.m_backend.data._M_elems[0xc] = 0;
              result_1.m_backend.data._M_elems[0xd] = 0;
              result_1.m_backend.data._M_elems[0xe] = 0;
              result_1.m_backend.data._M_elems[0xf] = 0;
              result_1.m_backend.data._M_elems[0x10] = 0;
              result_1.m_backend.data._M_elems[0x11] = 0;
              result_1.m_backend.data._M_elems[0x12] = 0;
              result_1.m_backend.data._M_elems[0x13] = 0;
              result_1.m_backend.data._M_elems[0x14] = 0;
              result_1.m_backend.data._M_elems[0x15] = 0;
              result_1.m_backend.data._M_elems[0x16] = 0;
              result_1.m_backend.data._M_elems[0x17] = 0;
              result_1.m_backend.data._M_elems[0x18] = 0;
              result_1.m_backend.data._M_elems[0x19] = 0;
              result_1.m_backend.data._M_elems._104_5_ = 0;
              result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              if (&result_1.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar34)) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          (&result_1.m_backend,pcVar26);
                if (result_1.m_backend.data._M_elems[0] != 0 ||
                    result_1.m_backend.fpclass != cpp_dec_float_finite) {
                  result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
                }
              }
              else {
                if (&result_1.m_backend != pcVar26) {
                  pcVar30 = pcVar26;
                  pcVar22 = &result_1.m_backend;
                  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                    (pcVar22->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
                    pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                    pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar22 + (ulong)bVar35 * -8 + 4);
                  }
                  result_1.m_backend.exp = pcVar26->exp;
                  result_1.m_backend.neg = pcVar26->neg;
                  result_1.m_backend.fpclass = pcVar26->fpclass;
                  result_1.m_backend.prec_elem = pcVar26->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          (&result_1.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar34));
              }
              pcVar26 = &result_1.m_backend;
              pcVar30 = &local_e78;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4)
                ;
                pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4)
                ;
              }
              local_e78.exp = result_1.m_backend.exp;
              local_e78.neg = result_1.m_backend.neg;
              local_e78.fpclass = result_1.m_backend.fpclass;
              local_e78.prec_elem = result_1.m_backend.prec_elem;
              pnVar28 = &degeneps;
              pcVar26 = &result_1.m_backend;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pcVar26->data)._M_elems[0] = (pnVar28->m_backend).data._M_elems[0];
                pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4)
                ;
              }
              result_1.m_backend.exp = degeneps.m_backend.exp;
              result_1.m_backend.neg = degeneps.m_backend.neg;
              uVar13._4_4_ = degeneps.m_backend.prec_elem;
              uVar13._0_4_ = degeneps.m_backend.fpclass;
              if (result_1.m_backend.data._M_elems[0] != 0 ||
                  degeneps.m_backend.fpclass != cpp_dec_float_finite) {
                result_1.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
              }
              fVar20 = result_1.m_backend.fpclass;
              result_1.m_backend._120_8_ = uVar13;
              if ((fVar20 == cpp_dec_float_NaN || degeneps.m_backend.fpclass == cpp_dec_float_NaN)
                 || (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              compare(&local_e78,&result_1.m_backend), -1 < iVar21)) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                          (&local_e78,&local_f08);
                uVar15 = result_1.m_backend._120_8_;
                if ((local_e78.fpclass != cpp_dec_float_NaN) &&
                   ((local_b48.fpclass != cpp_dec_float_NaN &&
                    (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              compare(&local_e78,&local_b48), uVar15 = result_1.m_backend._120_8_,
                    -1 < iVar21)))) {
                  pcVar26 = &local_f08;
                  pcVar30 = &result_1.m_backend;
                  for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                    (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                    pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                    pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                  }
                  result_1.m_backend.exp = local_f08.exp;
                  result_1.m_backend.neg = local_f08.neg;
                  uVar15._0_4_ = local_f08.fpclass;
                  uVar15._4_4_ = local_f08.prec_elem;
                  result_1.m_backend.fpclass = local_f08.fpclass;
                  result_1.m_backend.prec_elem = local_f08.prec_elem;
                  if (result_1.m_backend.data._M_elems[0] != 0 ||
                      local_f08.fpclass != cpp_dec_float_finite) {
                    result_1.m_backend.neg = (bool)(local_f08.neg ^ 1);
                  }
                  if (((local_f08.fpclass != cpp_dec_float_NaN) &&
                      (uVar15 = result_1.m_backend._120_8_, local_cd8.fpclass != cpp_dec_float_NaN))
                     && (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                  compare(&result_1.m_backend,&local_cd8),
                        uVar15 = result_1.m_backend._120_8_, 0 < iVar21)) {
                    iVar21 = (*(this->
                               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._vptr_SPxRatioTester[3])();
                    enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(extraout_var_32,iVar21),iVar19);
                    pcVar26 = &local_e78;
                    pcVar30 = &local_d58;
                    for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                      (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                      pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                      pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                    }
                    local_d58.exp = local_e78.exp;
                    local_d58.neg = local_e78.neg;
                    local_d58.fpclass = local_e78.fpclass;
                    local_d58.prec_elem = local_e78.prec_elem;
                    puVar29 = local_f08.data._M_elems + 1;
                    puVar32 = local_cd8.data._M_elems + 1;
                    for (lVar23 = 0x1b; lVar23 != 0; lVar23 = lVar23 + -1) {
                      *puVar32 = *puVar29;
                      puVar29 = puVar29 + (ulong)bVar35 * -2 + 1;
                      puVar32 = puVar32 + (ulong)bVar35 * -2 + 1;
                    }
                    local_cd8.data._M_elems[0] = local_f08.data._M_elems[0];
                    local_cd8.neg =
                         (bool)((local_f08.data._M_elems[0] != 0 ||
                                local_f08.fpclass != cpp_dec_float_finite) ^ local_f08.neg);
                    goto LAB_005b517b;
                  }
                }
              }
              else {
                iVar21 = (*(this->
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._vptr_SPxRatioTester[3])();
                lVar23 = *plVar5;
                puVar29 = (uint *)(lVar23 + lVar34);
                pnVar28 = &local_330;
                for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                  (pnVar28->m_backend).data._M_elems[0] = *puVar29;
                  puVar29 = puVar29 + (ulong)bVar35 * -2 + 1;
                  pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
                }
                local_330.m_backend.exp = *(int *)(lVar23 + 0x70 + lVar34);
                local_330.m_backend.neg = *(bool *)(lVar23 + 0x74 + lVar34);
                local_330.m_backend._120_8_ = *(undefined8 *)(lVar23 + 0x78 + lVar34);
                SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::shiftUCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(extraout_var_33,iVar21),iVar19,&local_330);
                uVar15 = result_1.m_backend._120_8_;
              }
            }
          }
          else {
            iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_f08,&local_bc8);
            if (iVar21 < 1) {
              fVar20 = local_bc8.fpclass;
              goto LAB_005b4b0b;
            }
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)(*plVar8 + lVar34);
            lVar23 = *plVar5;
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x1c;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems[0xe] = 0;
            result_1.m_backend.data._M_elems[0xf] = 0;
            result_1.m_backend.data._M_elems[0x10] = 0;
            result_1.m_backend.data._M_elems[0x11] = 0;
            result_1.m_backend.data._M_elems[0x12] = 0;
            result_1.m_backend.data._M_elems[0x13] = 0;
            result_1.m_backend.data._M_elems[0x14] = 0;
            result_1.m_backend.data._M_elems[0x15] = 0;
            result_1.m_backend.data._M_elems[0x16] = 0;
            result_1.m_backend.data._M_elems[0x17] = 0;
            result_1.m_backend.data._M_elems[0x18] = 0;
            result_1.m_backend.data._M_elems[0x19] = 0;
            result_1.m_backend.data._M_elems._104_5_ = 0;
            result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            if (&result_1.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar34)) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&result_1.m_backend,pcVar26);
              if (result_1.m_backend.data._M_elems[0] != 0 ||
                  result_1.m_backend.fpclass != cpp_dec_float_finite) {
                result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
              }
            }
            else {
              if (&result_1.m_backend != pcVar26) {
                pcVar30 = pcVar26;
                pcVar22 = &result_1.m_backend;
                for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                  (pcVar22->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
                  pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar30 + (ulong)bVar35 * -8 + 4);
                  pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar22 + (ulong)bVar35 * -8 + 4);
                }
                result_1.m_backend.exp = pcVar26->exp;
                result_1.m_backend.neg = pcVar26->neg;
                result_1.m_backend.fpclass = pcVar26->fpclass;
                result_1.m_backend.prec_elem = pcVar26->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&result_1.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar34));
            }
            pcVar26 = &result_1.m_backend;
            pcVar30 = &local_e78;
            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
              (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
              pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
            }
            local_e78.exp = result_1.m_backend.exp;
            local_e78.neg = result_1.m_backend.neg;
            local_e78.fpclass = result_1.m_backend.fpclass;
            local_e78.prec_elem = result_1.m_backend.prec_elem;
            if (((result_1.m_backend.fpclass == cpp_dec_float_NaN) ||
                (degeneps.m_backend.fpclass == cpp_dec_float_NaN)) ||
               (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_e78,&degeneps.m_backend), iVar21 < 1)) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                        (&local_e78,&local_f08);
              uVar15 = result_1.m_backend._120_8_;
              if (((local_e78.fpclass == cpp_dec_float_NaN) ||
                  (local_b48.fpclass == cpp_dec_float_NaN)) ||
                 ((iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                      (&local_e78,&local_b48), uVar15 = result_1.m_backend._120_8_,
                  iVar21 < 0 ||
                  (((local_f08.fpclass == cpp_dec_float_NaN ||
                    (local_cd8.fpclass == cpp_dec_float_NaN)) ||
                   (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             compare(&local_f08,&local_cd8), uVar15 = result_1.m_backend._120_8_,
                   iVar21 < 1)))))) goto LAB_005b4c0c;
              iVar21 = (*(this->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(extraout_var_31,iVar21),iVar19);
              pcVar26 = &local_e78;
              pcVar30 = &local_d58;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4)
                ;
                pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4)
                ;
              }
              local_d58.exp = local_e78.exp;
              local_d58.neg = local_e78.neg;
              local_d58.fpclass = local_e78.fpclass;
              local_d58.prec_elem = local_e78.prec_elem;
              pcVar26 = &local_f08;
              pcVar30 = &local_cd8;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4)
                ;
                pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4)
                ;
              }
              local_cd8.neg = local_f08.neg;
LAB_005b517b:
              local_f44 = (uint)(uVar36 - 1);
              uVar15 = result_1.m_backend._120_8_;
              local_d58.exp = local_e78.exp;
              local_d58.neg = local_e78.neg;
              local_d58._120_8_ = local_e78._120_8_;
              local_cd8.exp = local_f08.exp;
              local_cd8._120_8_ = local_f08._120_8_;
            }
            else {
              iVar21 = (*(this->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              lVar23 = *plVar5;
              puVar29 = (uint *)(lVar23 + lVar34);
              pnVar28 = &local_2b0;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pnVar28->m_backend).data._M_elems[0] = *puVar29;
                puVar29 = puVar29 + (ulong)bVar35 * -2 + 1;
                pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
              }
              local_2b0.m_backend.exp = *(int *)(lVar23 + 0x70 + lVar34);
              local_2b0.m_backend.neg = *(bool *)(lVar23 + 0x74 + lVar34);
              local_2b0.m_backend._120_8_ = *(undefined8 *)(lVar23 + 0x78 + lVar34);
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::shiftLCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(extraout_var_30,iVar21),iVar19,&local_2b0);
              uVar15 = result_1.m_backend._120_8_;
            }
          }
LAB_005b4c0c:
          result_1.m_backend._120_8_ = uVar15;
          bVar18 = 1 < uVar36;
          uVar36 = uVar36 - 1;
        } while (bVar18);
      }
      iVar19 = (*(this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxRatioTester[3])();
      (**(code **)(*(long *)CONCAT44(extraout_var_34,iVar19) + 0x368))
                (&result_1.m_backend,(long *)CONCAT44(extraout_var_34,iVar19));
    } while (((local_a38.fpclass == cpp_dec_float_NaN) ||
             (result_1.m_backend.fpclass == cpp_dec_float_NaN)) ||
            (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (&local_a38,&result_1.m_backend), iVar19 != 0));
    if (-1 < (int)local_f44) {
      iVar19 = (*(this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxRatioTester[3])();
      bVar18 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(extraout_var_35,iVar19),&enterId);
      if (!bVar18) goto LAB_005b3bfc;
      lVar23 = *(long *)(lVar6 + 0xb8);
      lVar34 = (long)*(int *)(*(long *)(lVar6 + 0xa8) + (ulong)local_f44 * 4) * 0x80;
      *(undefined8 *)(lVar23 + 0x78 + lVar34) = 0x1c00000000;
      *(undefined1 (*) [16])(lVar23 + lVar34) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(lVar23 + 0x10 + lVar34) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(lVar23 + 0x20 + lVar34) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(lVar23 + 0x30 + lVar34) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(lVar23 + 0x40 + lVar34) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(lVar23 + 0x50 + lVar34) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(lVar23 + 0x60 + lVar34) = (undefined1  [16])0x0;
      *(undefined8 *)(lVar23 + 0x6d + lVar34) = 0;
      iVar19 = *(int *)(lVar6 + 0xa0);
      *(int *)(lVar6 + 0xa0) = iVar19 + -1;
      *(undefined4 *)(*(long *)(lVar6 + 0xa8) + (ulong)local_f44 * 4) =
           *(undefined4 *)(*(long *)(lVar6 + 0xa8) + -4 + (long)iVar19 * 4);
      goto LAB_005b3c6a;
    }
    if ((int)local_fd4 < 0) {
LAB_005b5b1a:
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&val->m_backend,0);
      enterId.super_DataKey = enterId.super_DataKey & 0xffffffff00000000;
      return (SPxId)enterId.super_DataKey;
    }
    iVar19 = (*(this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxRatioTester[3])();
    lVar23 = *(long *)(CONCAT44(extraout_var_36,iVar19) + 0xc58);
    lVar34 = *(long *)(lVar23 + 0x20);
    lVar23 = (long)*(int *)(*(long *)(lVar23 + 0x28) + 4 + (ulong)local_fd4 * 8);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 0x1c;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems[6] = 0;
    result_1.m_backend.data._M_elems[7] = 0;
    result_1.m_backend.data._M_elems[8] = 0;
    result_1.m_backend.data._M_elems[9] = 0;
    result_1.m_backend.data._M_elems[10] = 0;
    result_1.m_backend.data._M_elems[0xb] = 0;
    result_1.m_backend.data._M_elems[0xc] = 0;
    result_1.m_backend.data._M_elems[0xd] = 0;
    result_1.m_backend.data._M_elems[0xe] = 0;
    result_1.m_backend.data._M_elems[0xf] = 0;
    result_1.m_backend.data._M_elems[0x10] = 0;
    result_1.m_backend.data._M_elems[0x11] = 0;
    result_1.m_backend.data._M_elems[0x12] = 0;
    result_1.m_backend.data._M_elems[0x13] = 0;
    result_1.m_backend.data._M_elems[0x14] = 0;
    result_1.m_backend.data._M_elems[0x15] = 0;
    result_1.m_backend.data._M_elems[0x16] = 0;
    result_1.m_backend.data._M_elems[0x17] = 0;
    result_1.m_backend.data._M_elems[0x18] = 0;
    result_1.m_backend.data._M_elems[0x19] = 0;
    result_1.m_backend.data._M_elems._104_5_ = 0;
    result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    iVar19 = *(int *)(lVar34 + 0xc + lVar23 * 0x28);
    if (0 < iVar19) {
      pcVar26 = *(cpp_dec_float<200U,_int,_void> **)(lVar34 + lVar23 * 0x28);
      uVar33 = iVar19 + 1;
      do {
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)(int)(((cpp_dec_float<200U,_int,_void> *)&pcVar26[1].data)->data)._M_elems
                              [0] * 0x80 + *plVar5);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x1c;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems[8] = 0;
        result.m_backend.data._M_elems[9] = 0;
        result.m_backend.data._M_elems[10] = 0;
        result.m_backend.data._M_elems[0xb] = 0;
        result.m_backend.data._M_elems[0xc] = 0;
        result.m_backend.data._M_elems[0xd] = 0;
        result.m_backend.data._M_elems[0xe] = 0;
        result.m_backend.data._M_elems[0xf] = 0;
        result.m_backend.data._M_elems[0x10] = 0;
        result.m_backend.data._M_elems[0x11] = 0;
        result.m_backend.data._M_elems[0x12] = 0;
        result.m_backend.data._M_elems[0x13] = 0;
        result.m_backend.data._M_elems[0x14] = 0;
        result.m_backend.data._M_elems[0x15] = 0;
        result.m_backend.data._M_elems[0x16] = 0;
        result.m_backend.data._M_elems[0x17] = 0;
        result.m_backend.data._M_elems[0x18] = 0;
        result.m_backend.data._M_elems[0x19] = 0;
        result.m_backend.data._M_elems._104_5_ = 0;
        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        pcVar30 = pcVar26;
        if ((&result.m_backend != pcVar22) && (pcVar30 = pcVar22, pcVar26 != &result.m_backend)) {
          pcVar22 = pcVar26;
          pnVar28 = &result;
          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
            (pnVar28->m_backend).data._M_elems[0] =
                 (((cpp_dec_float<200U,_int,_void> *)&pcVar22->data)->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar35 * -8 + 4);
            pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
          }
          result.m_backend.exp = pcVar26->exp;
          result.m_backend.neg = pcVar26->neg;
          result.m_backend.fpclass = pcVar26->fpclass;
          result.m_backend.prec_elem = pcVar26->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&result.m_backend,pcVar30);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  (&result_1.m_backend,&result.m_backend);
        pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                  ((((cpp_dec_float<200U,_int,_void> *)&pcVar26[1].data)->data)._M_elems + 1);
        uVar33 = uVar33 - 1;
      } while (1 < uVar33);
    }
    pcVar26 = &result_1.m_backend;
    pnVar28 = &result;
    for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
      (pnVar28->m_backend).data._M_elems[0] = (pcVar26->data)._M_elems[0];
      pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
      pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
    }
    lVar23 = *plVar4;
    lVar24 = (ulong)local_fd4 * 0x80;
    pnVar28 = &result;
    puVar29 = (uint *)(lVar23 + lVar24);
    for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
      *puVar29 = (pnVar28->m_backend).data._M_elems[0];
      pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
      puVar29 = puVar29 + (ulong)bVar35 * -2 + 1;
    }
    *(int *)(lVar23 + 0x70 + lVar24) = result_1.m_backend.exp;
    *(bool *)(lVar23 + 0x74 + lVar24) = result_1.m_backend.neg;
    *(undefined8 *)(lVar23 + 0x78 + lVar24) = result_1.m_backend._120_8_;
    iVar19 = (*(this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxRatioTester[3])();
    bVar18 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(extraout_var_37,iVar19),&enterId);
    if (bVar18) {
      local_4c0 = 0x1c00000000;
      local_538[0] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[1] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[2] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[3] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[4] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[5] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[6] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[7] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[8] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[9] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[10] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[0xb] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[0xc] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[0xd] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[0xe] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[0xf] = (cpp_dec_float<200u,int,void>)0x0;
      local_528 = (undefined1  [16])0x0;
      local_518 = (undefined1  [16])0x0;
      local_508 = (undefined1  [16])0x0;
      local_4f8 = (undefined1  [16])0x0;
      local_4e8 = (undefined1  [16])0x0;
      local_4d8 = SUB1613((undefined1  [16])0x0,0);
      uStack_4cb = 0;
      uStack_4c8 = 0;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=(local_538,0.0);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setValue(local_c50,local_fd4,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_538);
      goto LAB_005b3c6a;
    }
    lVar23 = *(long *)(lVar25 + 0xb8);
    iVar19 = *(int *)(lVar23 + 0x70 + lVar24);
    bVar2 = *(byte *)(lVar23 + 0x74 + lVar24);
    uVar9 = *(undefined8 *)(lVar23 + 0x78 + lVar24);
    memmove(&local_f08,(void *)(lVar23 + lVar24),0x70);
    local_f08.exp = iVar19;
    local_f08.neg = (bool)bVar2;
    local_f08._120_8_ = uVar9;
    if ((fpclass_type)uVar9 == cpp_dec_float_NaN) {
LAB_005b56e7:
      pcVar26 = (cpp_dec_float<200U,_int,_void> *)(*local_e80 + lVar24);
      lVar23 = *plVar4;
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x1c;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems[8] = 0;
      result_1.m_backend.data._M_elems[9] = 0;
      result_1.m_backend.data._M_elems[10] = 0;
      result_1.m_backend.data._M_elems[0xb] = 0;
      result_1.m_backend.data._M_elems[0xc] = 0;
      result_1.m_backend.data._M_elems[0xd] = 0;
      result_1.m_backend.data._M_elems[0xe] = 0;
      result_1.m_backend.data._M_elems[0xf] = 0;
      result_1.m_backend.data._M_elems[0x10] = 0;
      result_1.m_backend.data._M_elems[0x11] = 0;
      result_1.m_backend.data._M_elems[0x12] = 0;
      result_1.m_backend.data._M_elems[0x13] = 0;
      result_1.m_backend.data._M_elems[0x14] = 0;
      result_1.m_backend.data._M_elems[0x15] = 0;
      result_1.m_backend.data._M_elems[0x16] = 0;
      result_1.m_backend.data._M_elems[0x17] = 0;
      result_1.m_backend.data._M_elems[0x18] = 0;
      result_1.m_backend.data._M_elems[0x19] = 0;
      result_1.m_backend.data._M_elems._104_5_ = 0;
      result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      if (&result_1.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar24)) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&result_1.m_backend,pcVar26);
        if (result_1.m_backend.data._M_elems[0] != 0 ||
            result_1.m_backend.fpclass != cpp_dec_float_finite) {
          result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
        }
      }
      else {
        if (&result_1.m_backend != pcVar26) {
          pcVar30 = pcVar26;
          pcVar22 = &result_1.m_backend;
          for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
            (pcVar22->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar35 * -8 + 4);
          }
          result_1.m_backend.exp = pcVar26->exp;
          result_1.m_backend.neg = pcVar26->neg;
          result_1.m_backend.fpclass = pcVar26->fpclass;
          result_1.m_backend.prec_elem = pcVar26->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&result_1.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar24));
      }
      pcVar26 = &result_1.m_backend;
      pcVar30 = &local_d58;
      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
        (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
        pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
        pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
      }
      local_d58.exp = result_1.m_backend.exp;
      local_d58.neg = result_1.m_backend.neg;
      local_d58.fpclass = result_1.m_backend.fpclass;
      local_d58.prec_elem = result_1.m_backend.prec_elem;
      pcVar26 = &local_f08;
      pcVar30 = &result_1.m_backend;
      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
        (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
        pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
        pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
      }
      result_1.m_backend.exp = local_f08.exp;
      result_1.m_backend.neg = local_f08.neg;
      result_1.m_backend.fpclass = local_f08.fpclass;
      result_1.m_backend.prec_elem = local_f08.prec_elem;
      if (result_1.m_backend.data._M_elems[0] != 0 || local_f08.fpclass != cpp_dec_float_finite) {
        result_1.m_backend.neg = (bool)(local_f08.neg ^ 1);
      }
      uVar14 = result_1.m_backend._120_8_;
      if (((((local_f08.fpclass != cpp_dec_float_NaN) &&
            (minStability.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&result_1.m_backend,&minStability.m_backend),
           uVar14 = result_1.m_backend._120_8_, iVar19 < 0)) &&
          ((local_d58.fpclass != cpp_dec_float_NaN &&
           ((this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).delta.m_backend.fpclass != cpp_dec_float_NaN)))) &&
         (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_d58,&pnVar27->m_backend), uVar14 = result_1.m_backend._120_8_,
         iVar19 < 0)) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::div_unsigned_long_long
                  (&minStability.m_backend,2);
        iVar19 = (*(this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._vptr_SPxRatioTester[3])();
        lVar23 = *plVar4;
        puVar29 = (uint *)(lVar23 + lVar24);
        pnVar28 = &local_430;
        for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
          (pnVar28->m_backend).data._M_elems[0] = *puVar29;
          puVar29 = puVar29 + (ulong)bVar35 * -2 + 1;
          pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
        }
        local_430.m_backend.exp = *(int *)(lVar23 + 0x70 + lVar24);
        local_430.m_backend.neg = *(bool *)(lVar23 + 0x74 + lVar24);
        local_430.m_backend._120_8_ = *(undefined8 *)(lVar23 + 0x78 + lVar24);
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(extraout_var_38,iVar19),local_fd4,&local_430);
        goto LAB_005b3c6a;
      }
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&result_1.m_backend,0,(type *)0x0);
      iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&local_f08,&result_1.m_backend);
      if (iVar19 < 1) goto LAB_005b56e7;
      pcVar26 = (cpp_dec_float<200U,_int,_void> *)(*local_e88 + lVar24);
      lVar23 = *plVar4;
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x1c;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems[8] = 0;
      result_1.m_backend.data._M_elems[9] = 0;
      result_1.m_backend.data._M_elems[10] = 0;
      result_1.m_backend.data._M_elems[0xb] = 0;
      result_1.m_backend.data._M_elems[0xc] = 0;
      result_1.m_backend.data._M_elems[0xd] = 0;
      result_1.m_backend.data._M_elems[0xe] = 0;
      result_1.m_backend.data._M_elems[0xf] = 0;
      result_1.m_backend.data._M_elems[0x10] = 0;
      result_1.m_backend.data._M_elems[0x11] = 0;
      result_1.m_backend.data._M_elems[0x12] = 0;
      result_1.m_backend.data._M_elems[0x13] = 0;
      result_1.m_backend.data._M_elems[0x14] = 0;
      result_1.m_backend.data._M_elems[0x15] = 0;
      result_1.m_backend.data._M_elems[0x16] = 0;
      result_1.m_backend.data._M_elems[0x17] = 0;
      result_1.m_backend.data._M_elems[0x18] = 0;
      result_1.m_backend.data._M_elems[0x19] = 0;
      result_1.m_backend.data._M_elems._104_5_ = 0;
      result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      if (&result_1.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar24)) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&result_1.m_backend,pcVar26);
        if (result_1.m_backend.data._M_elems[0] != 0 ||
            result_1.m_backend.fpclass != cpp_dec_float_finite) {
          result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
        }
      }
      else {
        if (&result_1.m_backend != pcVar26) {
          pcVar30 = pcVar26;
          pcVar22 = &result_1.m_backend;
          for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
            (pcVar22->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar35 * -8 + 4);
          }
          result_1.m_backend.exp = pcVar26->exp;
          result_1.m_backend.neg = pcVar26->neg;
          result_1.m_backend.fpclass = pcVar26->fpclass;
          result_1.m_backend.prec_elem = pcVar26->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&result_1.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar23 + lVar24));
      }
      pcVar26 = &result_1.m_backend;
      pcVar30 = &local_d58;
      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
        (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
        pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
        pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
      }
      local_d58.exp = result_1.m_backend.exp;
      local_d58.neg = result_1.m_backend.neg;
      local_d58.fpclass = result_1.m_backend.fpclass;
      local_d58.prec_elem = result_1.m_backend.prec_elem;
      uVar14 = result_1.m_backend._120_8_;
      if (((local_f08.fpclass != cpp_dec_float_NaN) &&
          (minStability.m_backend.fpclass != cpp_dec_float_NaN)) &&
         (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_f08,&minStability.m_backend),
         uVar14 = result_1.m_backend._120_8_, iVar19 < 0)) {
        pcVar26 = &local_d58;
        pcVar30 = &result_1.m_backend;
        for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
          (pcVar30->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
          pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar35 * -8 + 4);
        }
        result_1.m_backend.exp = local_d58.exp;
        result_1.m_backend.neg = local_d58.neg;
        uVar14._0_4_ = local_d58.fpclass;
        uVar14._4_4_ = local_d58.prec_elem;
        result_1.m_backend.fpclass = local_d58.fpclass;
        result_1.m_backend.prec_elem = local_d58.prec_elem;
        if (result_1.m_backend.data._M_elems[0] != 0 || local_d58.fpclass != cpp_dec_float_finite) {
          result_1.m_backend.neg = (bool)(local_d58.neg ^ 1);
        }
        if (((local_d58.fpclass != cpp_dec_float_NaN) &&
            (uVar14 = result_1.m_backend._120_8_,
            (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).delta.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&result_1.m_backend,&pnVar27->m_backend),
           uVar14 = result_1.m_backend._120_8_, iVar19 < 0)) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::div_unsigned_long_long
                    (&minStability.m_backend,2);
          iVar19 = (*(this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._vptr_SPxRatioTester[3])();
          lVar23 = *plVar4;
          puVar29 = (uint *)(lVar23 + lVar24);
          pnVar28 = &local_3b0;
          for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
            (pnVar28->m_backend).data._M_elems[0] = *puVar29;
            puVar29 = puVar29 + (ulong)bVar35 * -2 + 1;
            pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar28 + ((ulong)bVar35 * -2 + 1) * 4);
          }
          local_3b0.m_backend.exp = *(int *)(lVar23 + 0x70 + lVar24);
          local_3b0.m_backend.neg = *(bool *)(lVar23 + 0x74 + lVar24);
          local_3b0.m_backend._120_8_ = *(undefined8 *)(lVar23 + 0x78 + lVar24);
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(extraout_var_39,iVar19),local_fd4,&local_3b0);
          goto LAB_005b3c6a;
        }
      }
    }
    result_1.m_backend._120_8_ = uVar14;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
              (&local_d58,&local_f08);
    if (((local_d58.fpclass == cpp_dec_float_NaN) || (local_b48.fpclass == cpp_dec_float_NaN)) ||
       (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_d58,&local_b48), -1 < iVar19)) goto LAB_005b3bfc;
  } while( true );
}

Assistant:

SPxId SPxHarrisRT<R>::selectEnter(R& val, int, bool)
{
   int i, j;
   SPxId enterId;
   R stab, x, y;
   R max = 0.0;
   R sel = 0.0;
   R lastshift;
   R cuseeps;
   R ruseeps;
   R cmaxabs = 1;
   R rmaxabs = 1;
   int pnr, cnr;

   R minStability = this->tolerances()->scaleAccordingToEpsilon(1e-4);
   R epsilon      = this->solver()->epsilon();
   R degeneps     = degenerateEps();

   VectorBase<R>& pvec = this->solver()->pVec();
   SSVectorBase<R>& pupd = this->solver()->pVec().delta();

   VectorBase<R>& cvec = this->solver()->coPvec();
   SSVectorBase<R>& cupd = this->solver()->coPvec().delta();

   const VectorBase<R>& upb = this->solver()->upBound();
   const VectorBase<R>& lpb = this->solver()->lpBound();
   const VectorBase<R>& ucb = this->solver()->ucBound();
   const VectorBase<R>& lcb = this->solver()->lcBound();

   assert(this->delta > epsilon);
   assert(epsilon > 0);
   assert(this->solver()->maxCycle() > 0);

   this->solver()->coPvec().delta().setup();
   this->solver()->pVec().delta().setup();

   if(val > epsilon)
   {
      for(;;)
      {
         pnr = -1;
         cnr = -1;
         max = val;
         lastshift = this->solver()->shift();
         assert(this->delta > epsilon);

         // phase 1:
         maxDelta(
            &rmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            pupd.size(),         /* # of indices in pupd */
            pupd.indexMem(),     /* nonzero indices in pupd */
            pupd.values(),       /* update VectorBase<R> for vec */
            pvec.get_const_ptr(),                /* current VectorBase<R> */
            lpb.get_const_ptr(),                 /* lower bounds for vec */
            upb.get_const_ptr()                  /* upper bounds for vec */
         );

         maxDelta(
            &cmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            cupd.size(),         /* # of indices in cupd */
            cupd.indexMem(),     /* nonzero indices in cupd */
            cupd.values(),       /* update VectorBase<R> for vec */
            cvec.get_const_ptr(),                /* current VectorBase<R> */
            lcb.get_const_ptr(),                 /* lower bounds for vec */
            ucb.get_const_ptr()                  /* upper bounds for vec */
         );

         if(max == val)
            return enterId;


         // phase 2:
         stab = 0;
         sel = R(-infinity);
         ruseeps = rmaxabs * 0.001 * epsilon;

         if(ruseeps < epsilon)
            ruseeps = epsilon;

         cuseeps = cmaxabs * 0.001 * epsilon;

         if(cuseeps < epsilon)
            cuseeps = epsilon;

         for(j = pupd.size() - 1; j >= 0; --j)
         {
            i = pupd.index(j);
            x = pupd[i];

            if(x > ruseeps)
            {
               y = upb[i] - pvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUPbound(i, pvec[i] - degeneps);
               else
               {
                  y /= x;

                  if(y <= max && x >= stab)        // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = x;
                  }
               }
            }
            else if(x < -ruseeps)
            {
               y = lpb[i] - pvec[i];

               if(y > degeneps)
                  this->solver()->shiftLPbound(i, pvec[i] + degeneps);
               else
               {
                  y /= x;

                  if(y <= max && -x >= stab)       // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI01 removing value {}\n", pupd[i]);
               pupd.clearNum(j);
            }
         }

         for(j = cupd.size() - 1; j >= 0; --j)
         {
            i = cupd.index(j);
            x = cupd[i];

            if(x > cuseeps)
            {
               y = ucb[i] - cvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUCbound(i, cvec[i] - degeneps);
               else
               {
                  y /= x;

                  if(y <= max && x >= stab)        // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = x;
                  }
               }
            }
            else if(x < -cuseeps)
            {
               y = lcb[i] - cvec[i];

               if(y > degeneps)
                  this->solver()->shiftLCbound(i, cvec[i] + degeneps);
               else
               {
                  y /= x;

                  if(y <= max && -x >= stab)       // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI02 removing value {}\n", cupd[i]);
               cupd.clearNum(j);
            }
         }

         if(lastshift == this->solver()->shift())
         {
            if(cnr >= 0)
            {
               if(this->solver()->isBasic(enterId))
               {
                  cupd.clearNum(cnr);
                  continue;
               }
               else
                  break;
            }
            else if(pnr >= 0)
            {
               pvec[pnr] = this->solver()->vector(pnr) * cvec;

               if(this->solver()->isBasic(enterId))
               {
                  pupd.setValue(pnr, 0.0);
                  continue;
               }
               else
               {
                  x = pupd[pnr];

                  if(x > 0)
                  {
                     sel = upb[pnr] - pvec[pnr];

                     if(x < minStability && sel < this->delta)
                     {
                        minStability /= 2.0;
                        this->solver()->shiftUPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }
                  else
                  {
                     sel = lpb[pnr] - pvec[pnr];

                     if(-x < minStability && -sel < this->delta)
                     {
                        minStability /= 2.0;
                        this->solver()->shiftLPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }

                  sel /= x;
               }
            }
            else
            {
               val = 0;
               enterId.inValidate();
               return enterId;
            }

            if(sel > max)              // instability detected => recompute
               continue;               // ratio test with corrected value

            break;
         }
      }
   }
   else if(val < -epsilon)
   {
      for(;;)
      {
         pnr = -1;
         cnr = -1;
         max = val;
         lastshift = this->solver()->shift();
         assert(this->delta > epsilon);


         // phase 1:
         minDelta
         (
            &rmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            pupd.size(),         /* # of indices in pupd */
            pupd.indexMem(),     /* nonzero indices in pupd */
            pupd.values(),       /* update VectorBase<R> for vec */
            pvec.get_const_ptr(),                /* current VectorBase<R> */
            lpb.get_const_ptr(),                 /* lower bounds for vec */
            upb.get_const_ptr()                  /* upper bounds for vec */
         );

         minDelta
         (
            &cmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            cupd.size(),         /* # of indices in cupd */
            cupd.indexMem(),     /* nonzero indices in cupd */
            cupd.values(),       /* update VectorBase<R> for vec */
            cvec.get_const_ptr(),                /* current VectorBase<R> */
            lcb.get_const_ptr(),                 /* lower bounds for vec */
            ucb.get_const_ptr()                  /* upper bounds for vec */
         );

         if(max == val)
            return enterId;


         // phase 2:
         stab = 0;
         sel = R(infinity);
         ruseeps = rmaxabs * epsilon * 0.001;
         cuseeps = cmaxabs * epsilon * 0.001;

         for(j = pupd.size() - 1; j >= 0; --j)
         {
            i = pupd.index(j);
            x = pupd[i];

            if(x > ruseeps)
            {
               y = lpb[i] - pvec[i];

               if(y > degeneps)
                  this->solver()->shiftLPbound(i, pvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && x > stab)         // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = x;
                  }
               }
            }
            else if(x < -ruseeps)
            {
               y = upb[i] - pvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUPbound(i, pvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && -x > stab)        // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI03 removing value {}\n", pupd[i]);
               pupd.clearNum(j);
            }
         }

         for(j = cupd.size() - 1; j >= 0; --j)
         {
            i = cupd.index(j);
            x = cupd[i];

            if(x > cuseeps)
            {
               y = lcb[i] - cvec[i];

               if(y > degeneps)
                  this->solver()->shiftLCbound(i, cvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && x > stab)         // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = x;
                  }
               }
            }
            else if(x < -cuseeps)
            {
               y = ucb[i] - cvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUCbound(i, cvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && -x > stab)        // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI04 removing value {}\n", x);
               cupd.clearNum(j);
            }
         }

         if(lastshift == this->solver()->shift())
         {
            if(cnr >= 0)
            {
               if(this->solver()->isBasic(enterId))
               {
                  cupd.clearNum(cnr);
                  continue;
               }
               else
                  break;
            }
            else if(pnr >= 0)
            {
               pvec[pnr] = this->solver()->vector(pnr) * cvec;

               if(this->solver()->isBasic(enterId))
               {
                  pupd.setValue(pnr, 0.0);
                  continue;
               }
               else
               {
                  x = pupd[pnr];

                  if(x > 0)
                  {
                     sel = lpb[pnr] - pvec[pnr];

                     if(x < minStability && -sel < this->delta)
                     {
                        minStability /= 2;
                        this->solver()->shiftLPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }
                  else
                  {
                     sel = upb[pnr] - pvec[pnr];

                     if(-x < minStability && sel < this->delta)
                     {
                        minStability /= 2;
                        this->solver()->shiftUPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }

                  sel /= x;
               }
            }
            else
            {
               val = 0;
               enterId.inValidate();
               return enterId;
            }

            if(sel < max)              // instability detected => recompute
               continue;               // ratio test with corrected value

            break;
         }
      }
   }

   assert(max * val >= 0);
   assert(enterId.type() != SPxId::INVALID);

   val = sel;

   return enterId;
}